

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(int *rowVals,int *colPtrs,int *indx,int *consP)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  int iVar39;
  int k_1;
  long lVar40;
  double *pdVar41;
  double *pdVar42;
  int iVar43;
  double *pdVar44;
  double *pdVar45;
  long lVar46;
  double *pdVar47;
  int iVar48;
  double *pdVar49;
  double *pdVar50;
  int l;
  int iVar51;
  double *pdVar52;
  double *__s;
  int k;
  double *pdVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  undefined1 auVar123 [16];
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  undefined4 uVar194;
  undefined4 uVar195;
  undefined4 uVar196;
  undefined4 uVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  undefined4 uVar272;
  undefined4 uVar273;
  undefined4 uVar274;
  undefined4 uVar275;
  undefined4 uVar276;
  undefined4 uVar277;
  undefined4 uVar278;
  undefined4 uVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  GpuArray<double,_21U> conc;
  Real h_RT [21];
  Real c_R [21];
  Real dcRdT [21];
  double adStack_1480 [33];
  undefined1 local_1378 [16];
  double local_1368;
  double dStack_1360;
  double dStack_1358;
  double local_1350;
  double dStack_1348;
  double dStack_1340;
  double local_1338;
  double local_1318;
  double local_1310;
  double local_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  double local_12e8;
  double dStack_12e0;
  double local_12d8;
  double dStack_12d0;
  double local_12c8;
  double dStack_12c0;
  double local_12b8;
  double dStack_12b0;
  double local_12a8;
  double dStack_12a0;
  double local_1298;
  double dStack_1290;
  double local_1288;
  double dStack_1280;
  double local_1278;
  double dStack_1270;
  double local_1268;
  double dStack_1260;
  double local_1258;
  double dStack_1250;
  double local_1248;
  double local_1240;
  double local_1238 [11];
  undefined1 auStack_11e0 [16];
  double dStack_11d0;
  double local_11c8;
  double dStack_11c0;
  double local_11b8;
  double dStack_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double local_1188;
  double local_1180;
  double dStack_1178;
  double local_1170;
  double local_1168;
  double local_1160;
  double local_1158;
  double local_1150;
  double local_1148;
  double local_1140;
  double local_1138;
  double local_1130;
  double local_1128;
  double local_1120;
  double local_1118;
  double local_1110 [2];
  double local_1100;
  double local_10f8 [3];
  double adStack_10e0 [442];
  undefined1 local_310 [16];
  double local_300;
  double dStack_2f8;
  double local_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double local_2a0;
  double dStack_298;
  double dStack_290;
  double local_288;
  double local_270;
  int local_264;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  int *local_240;
  double local_238 [22];
  double local_188 [22];
  double local_d8;
  double local_d0 [2];
  double local_c0 [2];
  double local_b0 [2];
  double local_a0 [2];
  double local_90 [2];
  double local_80 [2];
  double local_70 [2];
  double local_60 [2];
  double adStack_50 [2];
  double adStack_40 [2];
  
  adStack_1480[0] = 7.88972441712595e-318;
  local_240 = colPtrs;
  memset(&local_1188,0,0xf20);
  adStack_1480[0] = 7.88979852697283e-318;
  memset(adStack_1480 + 1,0,0xa8);
  pdVar42 = &local_d8;
  local_258 = adStack_50;
  local_248 = local_188 + 0x11;
  local_250 = local_188 + 0x13;
  local_260 = adStack_40;
  lVar40 = 1;
  auVar123 = _DAT_0077bb30;
  do {
    if (SUB164(auVar123 ^ _DAT_0077bb40,4) == -0x80000000 &&
        SUB164(auVar123 ^ _DAT_0077bb40,0) < -0x7fffffeb) {
      adStack_1480[lVar40] = 0.047619047619047616;
      adStack_1480[lVar40 + 1] = 0.047619047619047616;
    }
    lVar46 = auVar123._8_8_;
    auVar123._0_8_ = auVar123._0_8_ + 2;
    auVar123._8_8_ = lVar46 + 2;
    lVar40 = lVar40 + 2;
  } while (lVar40 != 0x17);
  local_264 = *consP;
  __s = &local_1188;
  lVar40 = 0;
  adStack_1480[0] = 7.89093981861472e-318;
  memset(__s,0,0xf20);
  adStack_1480[0] = 7.89103863174389e-318;
  memset(adStack_1480 + 0x17,0,0xa8);
  local_1240 = 0.0;
  do {
    local_1240 = local_1240 + adStack_1480[lVar40 + 1];
    lVar40 = lVar40 + 1;
  } while (lVar40 != 0x15);
  local_12e8 = 2.9101473600491667;
  dStack_12e0 = 19.482439934646393;
  local_12d8 = 22.00757879476429;
  dStack_12d0 = 3.2555381179699996;
  local_12c8 = 6.1092103122075;
  dStack_12c0 = -15.524086927680834;
  local_12b8 = 5.3818731557687505;
  dStack_12b0 = 35.602608086557915;
  local_12a8 = 38.543891960460414;
  dStack_12a0 = 17.114317783399166;
  local_1298 = 0.4349435637083328;
  dStack_1290 = -5.748131844745;
  local_1288 = -26.605086887896665;
  dStack_1280 = 7.7442483232375;
  local_1278 = -3.2271354189666677;
  dStack_1270 = 8.078776559375;
  local_1268 = 12.395261584404166;
  dStack_1260 = 18.914627724425003;
  local_1258 = 3.874817692333335;
  dStack_1250 = 3.0794231235708334;
  local_1248 = 2.0030833333333335;
  local_1300 = adStack_1480[2] * adStack_1480[8];
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 71955998.06277587) * 2.2543283025642333e+17;
  local_12f0 = dVar54 / (dVar54 + 1.0);
  local_12f8 = -0.0005580285508678667 / (dVar54 + 1.0);
  adStack_1480[0] = 7.89299019104496e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  local_1310 = (dVar54 + -0.09006792635084097) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.89358306981997e-318;
  dVar54 = pow(10.0,local_1318 * -0.46258518455098363);
  dVar125 = local_1318 * -0.9251703691019673 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.3374831843797492 * local_1308;
  dVar54 = dVar54 * local_12f0;
  dVar198 = (local_1300 * 71955998.06277587 + adStack_1480[10] * -0.15021418125880825) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  adStack_1480[0x1e] = adStack_1480[0x1e] - dVar198;
  adStack_1480[0x20] = dVar198 + adStack_1480[0x20];
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[8] * dVar54 * 71955998.06277587 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = dVar54 * 71955998.06277587 * adStack_1480[2] + 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = dVar54 * -0.15021418125880825 + 0.0;
  local_1198 = 0.0;
  local_11a8 = 0.0;
  dStack_11a0 = 0.0;
  local_11b8 = 0.0;
  dStack_11b0 = 0.0;
  local_11c8 = 0.0;
  dStack_11c0 = 0.0;
  dStack_11d0 = 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  pdVar41 = &local_1140;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-8] = pdVar41[-8] - dVar200;
    pdVar41[-2] = pdVar41[-2] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_1300 * -38376.53230014713 +
                    (((dStack_12a0 - (dStack_12e0 + dStack_12b0)) + 1.0) * -0.0006666666666666666 +
                    -0.0005333333333333334) * -0.15021418125880825 * adStack_1480[10]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.0001271297967317221 +
            dVar126 * -0.0005580285508678667 + local_12f8) * 2.302585092994046 * dVar198;
  pdVar41 = &local_1138;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_2e0 = dStack_2e0 - dVar54;
  local_12f0 = adStack_1480[2] * adStack_1480[10];
  dVar125 = (((adStack_1480[0x15] * -0.30000000000000004 +
              adStack_1480[0x13] + adStack_1480[0x13] +
              adStack_1480[0xc] * 0.5 +
              adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
              adStack_1480[0xd]) * 1e-12) / 111446030.23051862) * 8.322101603299873e+17;
  dStack_2d0 = dVar54 + dStack_2d0;
  local_12f8 = dVar125 / (dVar125 + 1.0);
  local_1300 = -0.000995959489983554 / (dVar125 + 1.0);
  adStack_1480[0] = 7.89772333993212e-318;
  dVar54 = log10(dVar125);
  local_1308 = 1.0 / ((dVar54 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_1310 = (dVar54 + -0.1863137764834265) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.89831621870713e-318;
  dVar54 = pow(10.0,local_1318 * -0.31893466196503506);
  dVar125 = local_1318 * -0.6378693239300701 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.1550470206955945 * local_1308;
  dVar54 = dVar54 * local_12f8;
  dVar198 = (local_12f0 * 111446030.23051862 + adStack_1480[0xb] * -5.675915683847628) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  adStack_1480[0x20] = adStack_1480[0x20] - dVar198;
  local_1378._0_8_ = dVar198 + (double)local_1378._0_8_;
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[10] * dVar54 * 111446030.23051862 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = dVar54 * 111446030.23051862 * adStack_1480[2] + 0.0;
  local_1238[10] = dVar54 * -5.675915683847628 + 0.0;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  dStack_11b0 = 0.0;
  local_11a8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = 0.0;
  dStack_11d0 = 0.0;
  local_11c8 = 0.0;
  auStack_11e0 = ZEXT816(0);
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-9] = pdVar41[-9] - dVar200;
    pdVar41[-1] = pdVar41[-1] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_12f0 * -37261.015183856354 +
                    (((local_1298 - (dStack_12e0 + dStack_12a0)) + 1.0) * -0.0006666666666666666 +
                    -0.0003343413408874632) * -5.675915683847628 * adStack_1480[0xb]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.00011772029828908056
            + dVar126 * -0.000995959489983554 + local_1300) * 2.302585092994046 * dVar198;
  pdVar41 = &local_1118;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_2d0 = dStack_2d0 - dVar54;
  local_2c8 = dVar54 + local_2c8;
  local_12f0 = adStack_1480[2] * adStack_1480[0xe];
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 39795255.79748703) * 5756549223630996.0;
  local_12f8 = dVar54 / (dVar54 + 1.0);
  local_1300 = -0.0007194001075784557 / (dVar54 + 1.0);
  adStack_1480[0] = 7.90245648881928e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1310 = (dVar54 + -0.1786261669350975) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.90304936759429e-318;
  dVar54 = pow(10.0,local_1318 * -0.33040870606701866);
  dVar125 = local_1318 * -0.6608174121340373 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.1696190567051137 * local_1308;
  dVar54 = dVar54 * local_12f8;
  dVar198 = (local_12f0 * 39795255.79748703 + adStack_1480[0xf] * -367.47982351959547) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  dStack_1360 = dStack_1360 - dVar198;
  dStack_1358 = dVar198 + dStack_1358;
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[0xe] * dVar54 * 39795255.79748703 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  dStack_11d0 = dVar54 * 39795255.79748703 * adStack_1480[2] + 0.0;
  local_11c8 = dVar54 * -367.47982351959547 + 0.0;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  dStack_11b0 = 0.0;
  local_11a8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = 0.0;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-0xd] = pdVar41[-0xd] - dVar200;
    pdVar41[-1] = pdVar41[-1] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_12f0 * 10420.408369112773 +
                    (((local_1278 - (dStack_12e0 + dStack_1280)) + 1.0) * -0.0006666666666666666 +
                    0.0002618505186181212) * -367.47982351959547 * adStack_1480[0xf]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.0001220771720522275 +
            dVar126 * -0.0007194001075784557 + local_1300) * 2.302585092994046 * dVar198;
  pdVar41 = local_1110;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_2b0 = dStack_2b0 - dVar54;
  dStack_2a8 = dVar54 + dStack_2a8;
  local_12f0 = adStack_1480[2] * adStack_1480[0xf];
  dVar54 = (((adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 6244953.487472275) * 193693058799875.4;
  local_12f8 = dVar54 / (dVar54 + 1.0);
  local_1300 = -0.001233681740997213 / (dVar54 + 1.0);
  adStack_1480[0] = 7.90708588392081e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1310 = (dVar54 + -0.09427787237484897) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.90767876269582e-318;
  dVar54 = pow(10.0,local_1318 * -0.4563016830226135);
  dVar125 = local_1318 * -0.912603366045227 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.3295031374387192 * local_1308;
  dVar54 = dVar54 * local_12f8;
  dVar198 = (local_12f0 * 6244953.487472275 + adStack_1480[0x10] * -27501071940.071716) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  dStack_1358 = dStack_1358 - dVar198;
  local_1350 = dVar198 + local_1350;
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[0xf] * dVar54 * 6244953.487472275 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  dStack_11d0 = 0.0;
  local_11c8 = dVar54 * 6244953.487472275 * adStack_1480[2] + 0.0;
  dStack_11c0 = dVar54 * -27501071940.071716 + 0.0;
  local_1198 = 0.0;
  local_11a8 = 0.0;
  dStack_11a0 = 0.0;
  local_11b8 = 0.0;
  dStack_11b0 = 0.0;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-0xe] = pdVar41[-0xe] - dVar200;
    pdVar41[-1] = pdVar41[-1] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_12f0 * 5521.547321046288 +
                    (((dStack_1270 - (dStack_12e0 + local_1278)) + 1.0) * -0.0006666666666666666 +
                    0.0008841614804854543) * -27501071940.071716 * adStack_1480[0x10]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -8.975305961941277e-05 +
            dVar126 * -0.001233681740997213 + local_1300) * 2.302585092994046 * dVar198;
  pdVar41 = &local_1100;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_2a8 = dStack_2a8 - dVar54;
  local_2a0 = dVar54 + local_2a0;
  local_12f0 = adStack_1480[2] * adStack_1480[0x11];
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 16225653.552515732) * 7.275514395950915e+16;
  local_12f8 = dVar54 / (dVar54 + 1.0);
  local_1300 = -0.0018374389917122033 / (dVar54 + 1.0);
  adStack_1480[0] = 7.91183385477735e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1310 = (dVar54 + -0.015265883794403325) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.91242673355235e-318;
  dVar54 = pow(10.0,local_1318 * -0.5742300241874577);
  dVar125 = local_1318 * -1.1484600483749154 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.4792721307180714 * local_1308;
  dVar54 = dVar54 * local_12f8;
  dVar198 = (local_12f0 * 16225653.552515732 + adStack_1480[0x12] * -67434469.58138922) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  dStack_1348 = dStack_1348 - dVar198;
  dStack_1340 = dVar198 + dStack_1340;
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[0x11] * dVar54 * 16225653.552515732 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  dStack_11d0 = 0.0;
  local_11c8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = dVar54 * 16225653.552515732 * adStack_1480[2] + 0.0;
  dStack_11b0 = dVar54 * -67434469.58138922 + 0.0;
  local_1198 = 0.0;
  local_11a8 = 0.0;
  dStack_11a0 = 0.0;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-0x10] = pdVar41[-0x10] - dVar200;
    pdVar41[-1] = pdVar41[-1] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_12f0 * 11515.557849353894 +
                    (((dStack_1260 - (dStack_12e0 + local_1268)) + 1.0) * -0.0006666666666666666 +
                    0.0007097130363398179) * -67434469.58138922 * adStack_1480[0x12]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.00018029438599527205
            + dVar126 * -0.0018374389917122033 + local_1300) * 2.302585092994046 * dVar198;
  pdVar41 = local_10f8;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_298 = dStack_298 - dVar54;
  dStack_290 = dVar54 + dStack_290;
  local_12f0 = adStack_1480[2] * adStack_1480[0x12];
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 219941642.44158944) * 6.888873607161395e+17;
  local_12f8 = dVar54 / (dVar54 + 1.0);
  local_1300 = -0.001267383041404717 / (dVar54 + 1.0);
  adStack_1480[0] = 7.91661146957263e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  local_1310 = (dVar54 + -0.1601631500988638) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.91720434834764e-318;
  dVar54 = pow(10.0,local_1318 * -0.35796544761363613);
  dVar125 = local_1318 * -0.7159308952272723 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.2046161184693178 * local_1308;
  dVar54 = dVar54 * local_12f8;
  dVar198 = (local_12f0 * 219941642.44158944 + adStack_1480[0x13] * -123.84112181745292) * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] - dVar198;
  dStack_1340 = dStack_1340 - dVar198;
  local_1338 = dVar198 + local_1338;
  lVar40 = 0;
  local_1238[0] = 0.0;
  local_1238[1] = adStack_1480[0x12] * dVar54 * 219941642.44158944 + 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] = 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  dStack_11d0 = 0.0;
  local_11c8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = 0.0;
  dStack_11b0 = dVar54 * 219941642.44158944 * adStack_1480[2] + 0.0;
  local_11a8 = dVar54 * -123.84112181745292 + 0.0;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-0x11] = pdVar41[-0x11] - dVar200;
    pdVar41[-1] = pdVar41[-1] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_12f0 * -67440.72224696395 +
                    (((local_1258 - (dStack_12e0 + dStack_1260)) + 1.0) * -0.0006666666666666666 +
                    -0.0003066300746793522) * -123.84112181745292 * adStack_1480[0x13]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.00016037027791424038
            + dVar126 * -0.001267383041404717 + local_1300) * 2.302585092994046 * dVar198;
  pdVar41 = &local_1118;
  local_310._0_8_ = (double)local_310._0_8_ - dVar54;
  dStack_290 = dStack_290 - dVar54;
  local_288 = dVar54 + local_288;
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + local_1240 + adStack_1480[1] + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 6.312363615626772e-06) * 35752.450724543516;
  local_1300 = adStack_1480[1] * adStack_1480[0xc];
  local_12f0 = dVar54 / (dVar54 + 1.0);
  local_12f8 = -0.0009631147670810994 / (dVar54 + 1.0);
  adStack_1480[0] = 7.92135944042916e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  local_1310 = (dVar54 + -0.09697718965666909) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.92195231920417e-318;
  dVar54 = pow(10.0,local_1318 * -0.45227285125870287);
  dVar125 = local_1318 * -0.9045457025174057 * local_1318 * local_1310 * local_1308;
  dVar126 = dVar125 * -1.3243865210985526 * local_1308;
  dVar54 = dVar54 * local_12f0;
  dVar198 = (local_1300 * 6.312363615626772e-06 + adStack_1480[0xf] * -115.13226896846228) * dVar54;
  adStack_1480[0x17] = adStack_1480[0x17] - dVar198;
  local_1378._8_8_ = (double)local_1378._8_8_ - dVar198;
  dStack_1358 = dVar198 + dStack_1358;
  local_1238[0] = dVar54 * 6.312363615626772e-06 * adStack_1480[0xc] + 0.0;
  local_1238[9] = 0.0;
  local_1238[10] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[1] = 0.0;
  local_1238[2] = 0.0;
  auStack_11e0._8_8_ = 0;
  auStack_11e0._0_8_ = dVar54 * 6.312363615626772e-06 * adStack_1480[1] + 0.0;
  dStack_11d0 = 0.0;
  local_11c8 = dVar54 * -115.13226896846228 + 0.0;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  dStack_11b0 = 0.0;
  local_11a8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = 0.0;
  lVar40 = 0;
  do {
    dVar200 = local_1238[lVar40];
    pdVar41[-0xe] = pdVar41[-0xe] - dVar200;
    pdVar41[-3] = pdVar41[-3] - dVar200;
    *pdVar41 = dVar200 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_1300 * 1.1868939967403452e-07 +
                    (((local_1278 - (local_12e8 + dStack_1290)) + 1.0) * -0.0006666666666666666 +
                    0.01880268737691365) * -115.13226896846228 * adStack_1480[0xf]) +
           ((local_1310 * dVar125 * -1.27 + dVar126 * -0.67 + local_1318) * -0.0002754907583934973 +
            dVar126 * -0.0009631147670810994 + local_12f8) * 2.302585092994046 * dVar198;
  pdVar41 = &local_1140;
  adStack_10e0[0x1b9] = adStack_10e0[0x1b9] - dVar54;
  dStack_2c0 = dStack_2c0 - dVar54;
  dStack_2a8 = dVar54 + dStack_2a8;
  dVar54 = (((adStack_1480[0x15] * -0.30000000000000004 +
             adStack_1480[0x13] + adStack_1480[0x13] +
             adStack_1480[0xc] * 0.5 +
             adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
             adStack_1480[0xd]) * 1e-12) / 14295380.788738592) * 4.2554035761159823e+18;
  local_1300 = adStack_1480[10] * adStack_1480[10];
  local_12f0 = dVar54 / (dVar54 + 1.0);
  local_12f8 = -0.001974975711261012 / (dVar54 + 1.0);
  adStack_1480[0] = 7.92607282669049e-318;
  dVar54 = log10(dVar54);
  local_1308 = 1.0 / ((dVar54 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  local_1310 = (dVar54 + 0.12973051019251233) * local_1308;
  local_1318 = 1.0 / (local_1310 * local_1310 + 1.0);
  adStack_1480[0] = 7.9266657054655e-318;
  dVar54 = pow(10.0,local_1318 * -0.7906425525261378);
  dVar125 = local_1318 * -1.5812851050522756 * local_1318 * local_1310 * local_1308;
  local_1308 = dVar125 * -1.7541160417081951 * local_1308;
  dVar54 = dVar54 * local_12f0;
  dVar126 = (local_1300 * 14295380.788738592 + adStack_1480[0x13] * -4338.16492800087) * dVar54;
  adStack_1480[0x20] = adStack_1480[0x20] - (dVar126 + dVar126);
  local_1338 = dVar126 + local_1338;
  local_1238[0] = 0.0;
  local_1238[1] = 0.0;
  local_1238[2] = 0.0;
  local_1238[3] = 0.0;
  local_1238[4] = 0.0;
  local_1238[5] = 0.0;
  local_1238[6] = 0.0;
  local_1238[7] = 0.0;
  local_1238[8] = 0.0;
  local_1238[9] =
       (dVar54 * 14295380.788738592 + dVar54 * 14295380.788738592) * adStack_1480[10] + 0.0;
  local_1238[10] = 0.0;
  auStack_11e0 = ZEXT816(0);
  dStack_11d0 = 0.0;
  local_11c8 = 0.0;
  dStack_11c0 = 0.0;
  local_11b8 = 0.0;
  dStack_11b0 = 0.0;
  local_11a8 = dVar54 * -4338.16492800087 + 0.0;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  lVar40 = 0;
  do {
    dVar198 = local_1238[lVar40];
    *pdVar41 = *pdVar41 - (dVar198 + dVar198);
    pdVar41[9] = dVar198 + pdVar41[9];
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (local_1300 * -7262.089447255807 +
                    (((local_1258 - (dStack_12a0 + dStack_12a0)) + 1.0) * -0.0006666666666666666 +
                    -0.0005080025187560327) * -4338.16492800087 * adStack_1480[0x13]) +
           ((local_1310 * dVar125 * -1.27 + local_1308 * -0.67 + local_1318) *
            -0.00010911464158415095 + local_1308 * -0.001974975711261012 + local_12f8) *
           2.302585092994046 * dVar126;
  pdVar41 = &local_1180;
  dStack_2d0 = dStack_2d0 - (dVar54 + dVar54);
  local_288 = dVar54 + local_288;
  dVar54 = adStack_1480[0x15] * -0.30000000000000004 +
           adStack_1480[0x13] + adStack_1480[0x13] +
           adStack_1480[0xc] * 0.5 +
           adStack_1480[6] * 5.0 + adStack_1480[1] + local_1240 + adStack_1480[0xb] +
           adStack_1480[0xd];
  local_1238[3] =
       adStack_1480[2] * adStack_1480[3] * 333.3333333333333 +
       adStack_1480[5] * -7.276980120178465e-07;
  dVar125 = dVar54 * local_1238[3];
  adStack_1480[0x18] = adStack_1480[0x18] - dVar125;
  dVar126 = adStack_1480[0x19] - dVar125;
  adStack_1480[0x19] = dVar126;
  dVar125 = dVar125 + adStack_1480[0x1b];
  adStack_1480[0x1b] = dVar125;
  local_1238[1] = dVar54 * 333.3333333333333 * adStack_1480[3] + local_1238[3];
  local_1238[2] = dVar54 * 333.3333333333333 * adStack_1480[2] + local_1238[3];
  local_1238[4] = dVar54 * -7.276980120178465e-07 + local_1238[3];
  local_1238[5] = local_1238[3] * 6.0;
  local_1238[8] = local_1238[3];
  local_1238[9] = local_1238[3];
  local_1238[6] = local_1238[3];
  local_1238[7] = local_1238[3];
  local_1238[0] = local_1238[3] * 2.0;
  local_1238[10] = local_1238[0];
  auStack_11e0._0_8_ = local_1238[3] * 1.5;
  auStack_11e0._8_8_ = local_1238[0];
  dStack_11c0 = local_1238[3];
  local_11b8 = local_1238[3];
  dStack_11d0 = local_1238[3];
  local_11c8 = local_1238[3];
  dStack_11b0 = local_1238[3];
  local_11a8 = local_1238[3] * 3.0;
  dStack_11a0 = local_1238[3];
  local_1198 = local_1238[3] * 0.7;
  lVar40 = 0;
  pdVar45 = local_188 + 5;
  pdVar49 = local_188 + 7;
  pdVar50 = local_188 + 9;
  pdVar52 = local_188 + 0xb;
  do {
    dVar198 = local_1238[lVar40];
    *pdVar41 = *pdVar41 - dVar198;
    pdVar41[1] = pdVar41[1] - dVar198;
    pdVar41[3] = dVar198 + pdVar41[3];
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = (adStack_1480[2] * adStack_1480[3] * -0.2222222222222222 +
           (((local_12c8 - (dStack_12e0 + local_12d8)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -7.276980120178465e-07 * adStack_1480[5]) * dVar54;
  pdVar41 = &local_1128;
  auVar1._8_4_ = SUB84((double)local_310._8_8_ - dVar54,0);
  auVar1._0_8_ = (double)local_310._0_8_ - dVar54;
  auVar1._12_4_ = (int)((ulong)((double)local_310._8_8_ - dVar54) >> 0x20);
  local_310 = auVar1;
  dStack_2f8 = dVar54 + dStack_2f8;
  dVar54 = adStack_1480[0x15] * -0.5 +
           adStack_1480[0x13] + adStack_1480[0x13] +
           adStack_1480[0xd] * 2.5 +
           adStack_1480[0xc] * 0.5 +
           adStack_1480[6] * 5.0 + adStack_1480[4] * 5.0 + adStack_1480[1] + local_1240 +
           adStack_1480[0xb];
  local_1238[1] =
       adStack_1480[3] * adStack_1480[0xc] * 220.0432490668822 +
       adStack_1480[0xd] * -3.54614235835121e-08;
  dVar198 = local_1238[1] * dVar54;
  adStack_1480[0x19] = dVar126 - dVar198;
  local_1378._8_8_ = (double)local_1378._8_8_ - dVar198;
  local_1368 = dVar198 + local_1368;
  local_1238[0] = local_1238[1] + local_1238[1];
  local_1238[2] = dVar54 * 220.0432490668822 * adStack_1480[0xc] + local_1238[1];
  local_1238[3] = local_1238[1] * 6.0;
  local_1238[4] = local_1238[1];
  local_1238[5] = local_1238[1] * 6.0;
  uVar194 = SUB84(local_1238[1],0);
  uVar196 = (undefined4)((ulong)local_1238[1] >> 0x20);
  auVar16._8_4_ = uVar194;
  auVar16._0_8_ = local_1238[1];
  auVar16._12_4_ = uVar196;
  local_1238[8] = local_1238[1];
  local_1238[9] = auVar16._8_8_;
  auVar17._8_4_ = uVar194;
  auVar17._0_8_ = local_1238[1];
  auVar17._12_4_ = uVar196;
  local_1238[6] = local_1238[1];
  local_1238[7] = auVar17._8_8_;
  local_1238[10] = local_1238[1] + local_1238[1];
  auStack_11e0._0_8_ = local_1238[1] * 1.5 + adStack_1480[3] * dVar54 * 220.0432490668822;
  auStack_11e0._8_8_ = local_1238[1] * 3.5 + dVar54 * -3.54614235835121e-08;
  auVar18._8_4_ = uVar194;
  auVar18._0_8_ = local_1238[1];
  auVar18._12_4_ = uVar196;
  dStack_11c0 = local_1238[1];
  local_11b8 = auVar18._8_8_;
  auVar19._8_4_ = uVar194;
  auVar19._0_8_ = local_1238[1];
  auVar19._12_4_ = uVar196;
  dStack_11d0 = local_1238[1];
  local_11c8 = auVar19._8_8_;
  dStack_11b0 = local_1238[1];
  local_11a8 = local_1238[1] * 3.0;
  dStack_11a0 = local_1238[1];
  local_1198 = local_1238[1] * 0.5;
  lVar40 = 0;
  pdVar53 = local_188 + 0xd;
  do {
    dVar126 = local_1238[lVar40];
    pdVar41[-10] = pdVar41[-10] - dVar126;
    pdVar41[-1] = pdVar41[-1] - dVar126;
    *pdVar41 = dVar126 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (adStack_1480[3] * adStack_1480[0xc] * 0.14763924017103203 +
                    (((local_1288 - (local_12d8 + dStack_1290)) + 1.0) * -0.0006666666666666666 +
                    0.0006709555544062933) * -3.54614235835121e-08 * adStack_1480[0xd]);
  pdVar41 = &local_1180;
  local_310._8_8_ = (double)local_310._8_8_ - dVar54;
  dVar126 = ((adStack_1480[0x13] * 0.5 +
             adStack_1480[0xd] * 0.5 +
             adStack_1480[0xc] * -0.25 + ((local_1240 - adStack_1480[4]) - adStack_1480[6])) -
            adStack_1480[0x14]) - adStack_1480[0x15];
  local_2b8 = dVar54 + local_2b8;
  dStack_2c0 = dStack_2c0 - dVar54;
  local_1238[0] =
       adStack_1480[4] * adStack_1480[2] * 5196.603105918946 + adStack_1480[7] * -515.2276090538855;
  dVar54 = dVar126 * local_1238[0];
  adStack_1480[0x18] = adStack_1480[0x18] - dVar54;
  adStack_1480[0x1a] = adStack_1480[0x1a] - dVar54;
  adStack_1480[0x1d] = dVar54 + adStack_1480[0x1d];
  local_1238[1] = dVar126 * 5196.603105918946 * adStack_1480[4] + local_1238[0];
  local_1238[2] = local_1238[0];
  local_1238[3] = dVar126 * 5196.603105918946 * adStack_1480[2];
  local_1238[4] = local_1238[0];
  local_1238[5] = 0.0;
  local_1238[6] = dVar126 * -515.2276090538855 + local_1238[0];
  uVar194 = SUB84(local_1238[0],0);
  uVar196 = (undefined4)((ulong)local_1238[0] >> 0x20);
  auVar2._8_4_ = uVar194;
  auVar2._0_8_ = local_1238[0];
  auVar2._12_4_ = uVar196;
  local_1238[9] = local_1238[0];
  local_1238[10] = auVar2._8_8_;
  auVar3._8_4_ = uVar194;
  auVar3._0_8_ = local_1238[0];
  auVar3._12_4_ = uVar196;
  local_1238[7] = local_1238[0];
  local_1238[8] = auVar3._8_8_;
  auStack_11e0._0_8_ = local_1238[0] * 0.75;
  auStack_11e0._8_8_ = local_1238[0] * 1.5;
  auVar4._8_4_ = uVar194;
  auVar4._0_8_ = local_1238[0];
  auVar4._12_4_ = uVar196;
  dStack_11c0 = local_1238[0];
  local_11b8 = auVar4._8_8_;
  auVar5._8_4_ = uVar194;
  auVar5._0_8_ = local_1238[0];
  auVar5._12_4_ = uVar196;
  dStack_11d0 = local_1238[0];
  local_11c8 = auVar5._8_8_;
  dStack_11b0 = local_1238[0];
  local_11a8 = local_1238[0] * 1.5;
  dStack_11a0 = 0.0;
  local_1198 = 0.0;
  lVar40 = 0;
  do {
    dVar54 = local_1238[lVar40];
    *pdVar41 = *pdVar41 - dVar54;
    pdVar41[2] = pdVar41[2] - dVar54;
    pdVar41[5] = dVar54 + pdVar41[5];
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar126 = dVar126 * (adStack_1480[4] * adStack_1480[2] * -2.979385780726863 +
                      (((local_12b8 - (dStack_12e0 + dStack_12d0)) + 1.0) * -0.0006666666666666666 +
                      -0.0005733333333333334) * -515.2276090538855 * adStack_1480[7]);
  pdVar41 = &local_1180;
  dVar54 = adStack_1480[4] * adStack_1480[4] * adStack_1480[2];
  dVar244 = dVar54 * 1033.3424938946343 + adStack_1480[4] * adStack_1480[7] * -102.45280842339088;
  dVar199 = adStack_1480[4] * adStack_1480[4] * 1033.3424938946343;
  dVar54 = dVar54 * -1.1848993929991807 +
           ((((dStack_12d0 + local_12b8) - (dStack_12d0 + dStack_12d0 + dStack_12e0)) + 1.0) *
            -0.0006666666666666666 + -0.0011466666666666667) * -102.45280842339088 *
           adStack_1480[4] * adStack_1480[7];
  dVar127 = (adStack_1480[2] * 1033.3424938946343 + adStack_1480[2] * 1033.3424938946343) *
            adStack_1480[4] + adStack_1480[7] * -102.45280842339088;
  dVar214 = adStack_1480[4] * -102.45280842339088;
  dVar198 = adStack_1480[4] * adStack_1480[2] * adStack_1480[6];
  dVar205 = dVar198 * 36172.079901627476 + adStack_1480[7] * adStack_1480[6] * -3586.3532123502373;
  dVar170 = dVar198 * -18.327187150157922 +
            ((((dStack_12c0 + local_12b8) - (dStack_12e0 + dStack_12d0 + dStack_12c0)) + 1.0) *
             -0.0006666666666666666 + -0.0005066666666666667) * -3586.3532123502373 *
            adStack_1480[7] * adStack_1480[6];
  dVar172 = adStack_1480[4] * 36172.079901627476 * adStack_1480[6];
  dVar206 = adStack_1480[6] * adStack_1480[2] * 36172.079901627476;
  dVar198 = adStack_1480[2] * 36172.079901627476 * adStack_1480[4] +
            adStack_1480[7] * -3586.3532123502373;
  adStack_10e0[0x5a] = adStack_10e0[0x5a] - dVar198;
  adStack_10e0[0x5c] = adStack_10e0[0x5c] - dVar198;
  adStack_10e0[0x5f] = dVar198 + adStack_10e0[0x5f];
  dVar245 = adStack_1480[6] * -3586.3532123502373;
  dVar198 = adStack_1480[4] * adStack_1480[2] * adStack_1480[0x14];
  dVar207 = dVar198 * 1291.6781173682928 +
            adStack_1480[7] * adStack_1480[0x14] * -128.06601052923858;
  dVar173 = adStack_1480[4] * 1291.6781173682928 * adStack_1480[0x14];
  dVar174 = adStack_1480[0x14] * adStack_1480[2] * 1291.6781173682928;
  dVar198 = dVar198 * -1.4811242412489758 +
            ((((dStack_1250 + local_12b8) - (dStack_12e0 + dStack_12d0 + dStack_1250)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            adStack_1480[7] * adStack_1480[0x14];
  dVar246 = adStack_1480[0x14] * -128.06601052923858;
  dVar200 = adStack_1480[2] * 1291.6781173682928 * adStack_1480[4] +
            adStack_1480[7] * -128.06601052923858;
  adStack_10e0[0x18e] = adStack_10e0[0x18e] - dVar200;
  adStack_10e0[400] = adStack_10e0[400] - dVar200;
  adStack_10e0[0x193] = dVar200 + adStack_10e0[0x193];
  dVar171 = adStack_1480[4] * adStack_1480[2] * adStack_1480[0x15];
  dVar247 = dVar171 * 2014.7679457577242 +
            adStack_1480[7] * adStack_1480[0x15] * -199.75819787137542;
  adStack_1480[0x1a] = (((adStack_1480[0x1a] - dVar244) - dVar205) - dVar207) - dVar247;
  dVar200 = adStack_1480[4] * 2014.7679457577242 * adStack_1480[0x15];
  adStack_10e0[2] = (((adStack_10e0[2] - dVar199) - dVar172) - dVar173) - dVar200;
  adStack_10e0[4] = (((adStack_10e0[4] - dVar199) - dVar172) - dVar173) - dVar200;
  adStack_10e0[7] = dVar200 + dVar173 + dVar172 + dVar199 + adStack_10e0[7];
  dVar200 = adStack_1480[0x15] * adStack_1480[2] * 2014.7679457577242;
  adStack_10e0[0x2e] = (((adStack_10e0[0x2e] - dVar127) - dVar206) - dVar174) - dVar200;
  adStack_10e0[0x30] = (((adStack_10e0[0x30] - dVar127) - dVar206) - dVar174) - dVar200;
  adStack_1480[0x1d] = dVar247 + dVar207 + dVar205 + dVar244 + adStack_1480[0x1d];
  dVar172 = dVar171 * -1.0745429044041197 +
            ((((local_1248 + local_12b8) - (dStack_12e0 + dStack_12d0 + local_1248)) + 1.0) *
             -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
            adStack_1480[7] * adStack_1480[0x15];
  adStack_10e0[0x33] = dVar200 + dVar174 + dVar206 + dVar127 + adStack_10e0[0x33];
  dVar200 = adStack_1480[0x15] * -199.75819787137542;
  adStack_10e0[0x70] = (((adStack_10e0[0x70] - dVar214) - dVar245) - dVar246) - dVar200;
  adStack_10e0[0x72] = (((adStack_10e0[0x72] - dVar214) - dVar245) - dVar246) - dVar200;
  adStack_1480._232_16_ = CONCAT88(adStack_1480[0x1e],adStack_1480[0x1d]);
  adStack_10e0[0x75] = dVar200 + dVar246 + dVar245 + dVar214 + adStack_10e0[0x75];
  dVar200 = adStack_1480[2] * 2014.7679457577242 * adStack_1480[4] +
            adStack_1480[7] * -199.75819787137542;
  adStack_10e0[0x1a4] = adStack_10e0[0x1a4] - dVar200;
  adStack_10e0[0x1a6] = adStack_10e0[0x1a6] - dVar200;
  adStack_10e0[0x1a9] = dVar200 + adStack_10e0[0x1a9];
  local_310._0_8_ = (((((double)local_310._0_8_ - dVar126) - dVar54) - dVar170) - dVar198) - dVar172
  ;
  local_300 = ((((local_300 - dVar126) - dVar54) - dVar170) - dVar198) - dVar172;
  local_2e8 = dVar172 + dVar198 + dVar170 + dVar54 + dVar126 + local_2e8;
  dVar54 = adStack_1480[0x15] * -0.37 +
           adStack_1480[0x13] + adStack_1480[0x13] +
           ((((local_1240 - adStack_1480[1]) - adStack_1480[6]) + adStack_1480[0xb]) -
           adStack_1480[0xd]);
  local_1238[2] =
       adStack_1480[2] * adStack_1480[2] * 666.6666666666666 +
       adStack_1480[1] * -1.6792101947629015e-06;
  dVar126 = local_1238[2] * dVar54;
  adStack_1480[0x17] = adStack_1480[0x17] + dVar126;
  adStack_1480[0x18] =
       ((((adStack_1480[0x18] - dVar244) - dVar205) - dVar207) - dVar247) - (dVar126 + dVar126);
  local_1238[0] = dVar54 * -1.6792101947629015e-06;
  local_1238[1] =
       (dVar54 * 666.6666666666666 + dVar54 * 666.6666666666666) * adStack_1480[2] + local_1238[2];
  local_1238[3] = local_1238[2];
  local_1238[4] = local_1238[2];
  lVar40 = 0;
  local_1238[5] = 0.0;
  local_1238[8] = local_1238[2];
  local_1238[9] = local_1238[2];
  local_1238[6] = local_1238[2];
  local_1238[7] = local_1238[2];
  local_1238[10] = local_1238[2] + local_1238[2];
  auStack_11e0._8_8_ = 0;
  auStack_11e0._0_8_ = local_1238[2];
  dStack_11c0 = local_1238[2];
  local_11b8 = local_1238[2];
  dStack_11d0 = local_1238[2];
  local_11c8 = local_1238[2];
  dStack_11b0 = local_1238[2];
  local_11a8 = local_1238[2] * 3.0;
  dStack_11a0 = local_1238[2];
  local_1198 = local_1238[2] * 0.63;
  pdVar47 = local_188 + 0xf;
  do {
    dVar126 = local_1238[lVar40];
    pdVar41[-1] = pdVar41[-1] + dVar126;
    *pdVar41 = *pdVar41 - (dVar126 + dVar126);
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (adStack_1480[2] * adStack_1480[2] * -0.4444444444444444 +
                    (((local_12e8 - (dStack_12e0 + dStack_12e0)) + 1.0) * -0.0006666666666666666 +
                    -0.0006666666666666666) * -1.6792101947629015e-06 * adStack_1480[1]);
  pdVar41 = &local_1160;
  dVar126 = adStack_1480[2] * adStack_1480[2] * adStack_1480[1];
  dVar127 = dVar126 * 1118.3757819574057 +
            adStack_1480[1] * adStack_1480[1] * -2.8169820219582113e-06;
  dVar173 = dVar126 * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((local_12e8 + local_12e8) - (dStack_12e0 + dStack_12e0 + local_12e8)) + 1.0) *
            0.0006666666666666666) * -2.8169820219582113e-06 * adStack_1480[1] * adStack_1480[1];
  dVar205 = adStack_1480[2] * adStack_1480[2] * 1118.3757819574057 +
            adStack_1480[1] * -5.633964043916423e-06;
  dVar198 = (adStack_1480[1] * 1118.3757819574057 + adStack_1480[1] * 1118.3757819574057) *
            adStack_1480[2];
  dVar126 = adStack_1480[2] * adStack_1480[2] * adStack_1480[6];
  dVar206 = dVar126 * 6427.427351557215 + adStack_1480[1] * adStack_1480[6] * -1.618950230224919e-05
  ;
  dVar172 = dVar126 * -5.356189459631012 +
            (-0.0008333333333333333 -
            (((dStack_12c0 + local_12e8) - (dStack_12e0 + dStack_12e0 + dStack_12c0)) + 1.0) *
            0.0006666666666666666) * -1.618950230224919e-05 * adStack_1480[1] * adStack_1480[6];
  dVar170 = adStack_1480[2] * 12854.85470311443 * adStack_1480[6];
  dVar126 = adStack_1480[6] * -1.618950230224919e-05;
  dVar200 = adStack_1480[2] * adStack_1480[2] * 6427.427351557215 +
            adStack_1480[1] * -1.618950230224919e-05;
  adStack_10e0[0x59] = adStack_10e0[0x59] + dVar200;
  adStack_10e0[0x5a] = adStack_10e0[0x5a] - (dVar200 + dVar200);
  dVar174 = adStack_1480[2] * adStack_1480[2] * adStack_1480[0xd];
  dVar200 = dVar174 * 244.44444444444443 +
            adStack_1480[1] * adStack_1480[0xd] * -6.157104047463972e-07;
  dVar174 = dVar174 * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((local_1288 + local_12e8) - (dStack_12e0 + dStack_12e0 + local_1288)) + 1.0) *
            0.0006666666666666666) * -6.157104047463972e-07 * adStack_1480[1] * adStack_1480[0xd];
  adStack_1480[0x17] = adStack_1480[0x17] + dVar127 + dVar206 + dVar200;
  dVar199 = adStack_1480[2] * 488.88888888888886 * adStack_1480[0xd];
  dVar171 = adStack_1480[0xd] * -6.157104047463972e-07;
  local_1188 = local_1188 + dVar205 + dVar126 + dVar171;
  local_1180 = ((local_1180 - (dVar205 + dVar205)) - (dVar126 + dVar126)) - (dVar171 + dVar171);
  adStack_10e0[1] = adStack_10e0[1] + dVar198 + dVar170 + dVar199;
  adStack_10e0[2] =
       ((adStack_10e0[2] - (dVar198 + dVar198)) - (dVar170 + dVar170)) - (dVar199 + dVar199);
  dVar126 = adStack_1480[2] * adStack_1480[2] * 244.44444444444443 +
            adStack_1480[1] * -6.157104047463972e-07;
  adStack_10e0[0xf3] = adStack_10e0[0xf3] + dVar126;
  adStack_10e0[0xf4] = adStack_10e0[0xf4] - (dVar126 + dVar126);
  adStack_10e0[0x1b9] = adStack_10e0[0x1b9] + dVar54 + dVar173 + dVar172 + dVar174;
  local_310._0_8_ =
       ((((double)local_310._0_8_ - (dVar54 + dVar54)) - (dVar173 + dVar173)) - (dVar172 + dVar172))
       - (dVar174 + dVar174);
  dVar54 = adStack_1480[0x15] * -0.62 +
           adStack_1480[0x13] + adStack_1480[0x13] +
           adStack_1480[6] * 2.65 + adStack_1480[1] * -0.27 + local_1240 + adStack_1480[0xb];
  local_1238[2] =
       adStack_1480[2] * adStack_1480[5] * 9777.777777777777 +
       adStack_1480[6] * -7.029234294042697e-07;
  dVar126 = dVar54 * local_1238[2];
  adStack_1480[0x18] =
       (((adStack_1480[0x18] - (dVar127 + dVar127)) - (dVar206 + dVar206)) - (dVar200 + dVar200)) -
       dVar126;
  adStack_1480[0x1b] = dVar125 - dVar126;
  adStack_1480[0x1c] = dVar126 + adStack_1480[0x1c];
  local_1238[0] = local_1238[2] * 0.73;
  local_1238[1] = adStack_1480[5] * dVar54 * 9777.777777777777 + local_1238[2];
  local_1238[3] = local_1238[2];
  local_1238[4] = local_1238[2] + adStack_1480[2] * dVar54 * 9777.777777777777;
  local_1238[5] = dVar54 * -7.029234294042697e-07 + local_1238[2] * 3.65;
  uVar194 = SUB84(local_1238[2],0);
  uVar196 = (undefined4)((ulong)local_1238[2] >> 0x20);
  auVar6._8_4_ = uVar194;
  auVar6._0_8_ = local_1238[2];
  auVar6._12_4_ = uVar196;
  local_1238[8] = local_1238[2];
  local_1238[9] = auVar6._8_8_;
  auVar7._8_4_ = uVar194;
  auVar7._0_8_ = local_1238[2];
  auVar7._12_4_ = uVar196;
  local_1238[6] = local_1238[2];
  local_1238[7] = auVar7._8_8_;
  local_1238[10] = local_1238[2] + local_1238[2];
  auVar8._8_4_ = uVar194;
  auVar8._0_8_ = local_1238[2];
  auVar8._12_4_ = uVar196;
  dStack_11d0 = local_1238[2];
  local_11c8 = auVar8._8_8_;
  auStack_11e0._8_4_ = uVar194;
  auStack_11e0._0_8_ = local_1238[2];
  auStack_11e0._12_4_ = uVar196;
  dStack_11c0 = local_1238[2];
  local_11b8 = local_1238[2];
  dStack_11b0 = local_1238[2];
  local_11a8 = local_1238[2] * 3.0;
  dStack_11a0 = local_1238[2];
  local_1198 = local_1238[2] * 0.38;
  lVar40 = 0;
  do {
    dVar125 = local_1238[lVar40];
    pdVar41[-4] = pdVar41[-4] - dVar125;
    pdVar41[-1] = pdVar41[-1] - dVar125;
    *pdVar41 = dVar125 + *pdVar41;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (adStack_1480[2] * adStack_1480[5] * -13.037037037037036 +
                    (-0.0013333333333333333 -
                    ((dStack_12c0 - (dStack_12e0 + local_12c8)) + 1.0) * 0.0006666666666666666) *
                    -7.029234294042697e-07 * adStack_1480[6]);
  pdVar41 = &local_1120;
  dStack_2f8 = dStack_2f8 - dVar54;
  local_2f0 = dVar54 + local_2f0;
  dVar125 = adStack_1480[2] * adStack_1480[6] * adStack_1480[0xc];
  dVar198 = adStack_1480[0xe] * adStack_1480[6] * 4989960.261382571 + dVar125 * -1002.9930150071424;
  dVar125 = adStack_1480[0xe] * adStack_1480[6] * 15645.595296379073 +
            (0.0031354148083023287 -
            (((dStack_12c0 + dStack_12e0 + dStack_1290) - (dStack_1280 + dStack_12c0)) + -1.0) *
            0.0006666666666666666) * -1002.9930150071424 * dVar125;
  dVar126 = adStack_1480[6] * -1002.9930150071424 * adStack_1480[0xc];
  adStack_10e0[2] = adStack_10e0[2] + dVar126;
  adStack_10e0[0xc] = adStack_10e0[0xc] + dVar126;
  adStack_10e0[0xe] = adStack_10e0[0xe] - dVar126;
  dVar126 = adStack_1480[0xe] * 4989960.261382571 +
            adStack_1480[0xc] * adStack_1480[2] * -1002.9930150071424;
  adStack_10e0[0x5a] = adStack_10e0[0x5a] + dVar126;
  adStack_10e0[100] = adStack_10e0[100] + dVar126;
  adStack_10e0[0x66] = adStack_10e0[0x66] - dVar126;
  dVar126 = adStack_1480[2] * -1002.9930150071424 * adStack_1480[6];
  adStack_10e0[0xde] = adStack_10e0[0xde] + dVar126;
  adStack_10e0[0xe8] = adStack_10e0[0xe8] + dVar126;
  adStack_10e0[0xea] = adStack_10e0[0xea] - dVar126;
  dVar126 = adStack_1480[6] * 4989960.261382571;
  adStack_10e0[0x10a] = adStack_10e0[0x10a] + dVar126;
  adStack_10e0[0x114] = adStack_10e0[0x114] + dVar126;
  adStack_10e0[0x116] = adStack_10e0[0x116] - dVar126;
  local_310._0_8_ = ((double)local_310._0_8_ - dVar54) + dVar125;
  dStack_2c0 = dStack_2c0 + dVar125;
  dStack_2b0 = dStack_2b0 - dVar125;
  dVar54 = adStack_1480[0x13] + adStack_1480[0x13] +
           adStack_1480[0xc] * 0.5 +
           ((local_1240 + adStack_1480[1]) - adStack_1480[6]) + adStack_1480[0xb] +
           adStack_1480[0xd];
  local_1238[2] =
       adStack_1480[0xe] * 415830.02178188093 +
       adStack_1480[0xc] * adStack_1480[2] * -83.5827512505952;
  local_1238[0] = local_1238[2] + local_1238[2];
  local_1238[1] = adStack_1480[0xc] * dVar54 * -83.5827512505952 + local_1238[2];
  local_1238[3] = local_1238[2];
  local_1238[4] = local_1238[2];
  local_1238[5] = 0.0;
  uVar194 = SUB84(local_1238[2],0);
  uVar196 = (undefined4)((ulong)local_1238[2] >> 0x20);
  auVar20._8_4_ = uVar194;
  auVar20._0_8_ = local_1238[2];
  auVar20._12_4_ = uVar196;
  local_1238[8] = local_1238[2];
  local_1238[9] = auVar20._8_8_;
  auVar21._8_4_ = uVar194;
  auVar21._0_8_ = local_1238[2];
  auVar21._12_4_ = uVar196;
  local_1238[6] = local_1238[2];
  local_1238[7] = auVar21._8_8_;
  local_1238[10] = local_1238[0];
  auStack_11e0._8_8_ = local_1238[0];
  auStack_11e0._0_8_ = local_1238[2] * 1.5 + dVar54 * -83.5827512505952 * adStack_1480[2];
  dStack_11d0 = dVar54 * 415830.02178188093 + local_1238[2];
  auVar22._8_4_ = uVar194;
  auVar22._0_8_ = local_1238[2];
  auVar22._12_4_ = uVar196;
  local_11b8 = local_1238[2];
  dStack_11b0 = auVar22._8_8_;
  auVar23._8_4_ = uVar194;
  auVar23._0_8_ = local_1238[2];
  auVar23._12_4_ = uVar196;
  local_11c8 = local_1238[2];
  dStack_11c0 = auVar23._8_8_;
  local_11a8 = local_1238[2] * 3.0;
  dStack_11a0 = local_1238[2];
  local_1198 = local_1238[2];
  local_1238[2] = local_1238[2] * dVar54;
  adStack_1480[0x18] = adStack_1480[0x18] + dVar198 + local_1238[2];
  local_1378._8_8_ = (double)local_1378._8_8_ + dVar198 + local_1238[2];
  dStack_1360 = (dStack_1360 - dVar198) - local_1238[2];
  lVar40 = 0;
  do {
    dVar125 = local_1238[lVar40];
    pdVar41[-0xc] = pdVar41[-0xc] + dVar125;
    pdVar41[-2] = pdVar41[-2] + dVar125;
    *pdVar41 = *pdVar41 - dVar125;
    lVar40 = lVar40 + 1;
    pdVar41 = pdVar41 + 0x16;
  } while (lVar40 != 0x15);
  dVar54 = dVar54 * (adStack_1480[0xe] * 1303.7996080315893 +
                    (0.0031354148083023287 -
                    (((dStack_12e0 + dStack_1290) - dStack_1280) + -1.0) * 0.0006666666666666666) *
                    -83.5827512505952 * adStack_1480[0xc] * adStack_1480[2]);
  dVar201 = adStack_1480[1] * adStack_1480[3] * 1831069.794862108 +
            adStack_1480[2] * adStack_1480[5] * -1587014.959464585;
  dVar128 = adStack_1480[1] * adStack_1480[3] * 5835.198557030137 +
            (0.0031867701457385282 -
            ((dStack_12e0 + local_12c8) - (local_12e8 + local_12d8)) * 0.0006666666666666666) *
            -1587014.959464585 * adStack_1480[2] * adStack_1480[5];
  dVar208 = adStack_1480[3] * 1831069.794862108;
  dStack_1178 = dStack_1178 - dVar208;
  dVar55 = adStack_1480[5] * -1587014.959464585;
  dVar125 = adStack_1480[1] * 1831069.794862108;
  adStack_10e0[0x17] = adStack_10e0[0x17] - dVar125;
  dVar175 = adStack_1480[2] * -1587014.959464585;
  dVar307 = adStack_1480[7] * 20000000.0;
  adStack_10e0[0x1d] = adStack_10e0[0x1d] - dVar307;
  dVar313 = adStack_1480[5] * -0.44037520695372745;
  dVar308 = adStack_1480[4] * -0.44037520695372745;
  dVar202 = adStack_1480[3] * 20000000.0;
  adStack_10e0[0x71] = adStack_10e0[0x71] - dVar202;
  dVar56 = adStack_1480[0xe] * -2.787694465907913e-05;
  dVar299 = adStack_1480[3] * adStack_1480[8] * 0.0 +
            (0.0 - ((dStack_1280 + dStack_12e0) - (dStack_12b0 + local_12d8)) *
                   0.0006666666666666666) * -2.787694465907913e-05 *
            adStack_1480[2] * adStack_1480[0xe];
  dVar305 = adStack_1480[7] * adStack_1480[3] * 0.0 +
            (0.0 - ((local_12c8 + dStack_12d0) - (local_12d8 + local_12b8)) * 0.0006666666666666666)
            * -0.44037520695372745 * adStack_1480[5] * adStack_1480[4];
  dVar126 = adStack_1480[3] * adStack_1480[8] * 80000000.0 +
            adStack_1480[2] * adStack_1480[0xe] * -2.787694465907913e-05;
  dVar200 = adStack_1480[7] * adStack_1480[3] * 20000000.0 +
            adStack_1480[5] * adStack_1480[4] * -0.44037520695372745;
  dVar129 = adStack_1480[8] * 80000000.0;
  adStack_10e0[0x1e] = adStack_10e0[0x1e] - dVar129;
  dVar57 = adStack_1480[3] * 80000000.0;
  adStack_10e0[0x87] = adStack_10e0[0x87] - dVar57;
  dVar314 = adStack_1480[2] * -2.787694465907913e-05;
  dVar31 = ((adStack_1480[0x19] - dVar201) - dVar200) - dVar126;
  adStack_1480[0x1a] = dVar200 + adStack_1480[0x1a];
  auVar9._8_4_ = SUB84(adStack_1480[0x1a],0);
  auVar9._0_8_ = dVar31;
  auVar9._12_4_ = (int)((ulong)adStack_1480[0x1a] >> 0x20);
  adStack_1480[0x1d] = adStack_1480[0x1d] - dVar200;
  dVar198 = adStack_1480[0x1e] - dVar126;
  auVar10._8_4_ = SUB84(dVar198,0);
  auVar10._0_8_ = adStack_1480[0x1d];
  auVar10._12_4_ = (int)((ulong)dVar198 >> 0x20);
  dVar58 = adStack_1480[0xe] * -1.2126178147109573e-07;
  dVar130 = adStack_1480[9] * 15000000.0;
  adStack_10e0[0x1f] = adStack_10e0[0x1f] - dVar130;
  dVar59 = adStack_1480[3] * 15000000.0;
  adStack_10e0[0x9d] = adStack_10e0[0x9d] - dVar59;
  dVar174 = adStack_1480[2] * -1.2126178147109573e-07;
  adStack_10e0[0xa8] = dVar59 + adStack_10e0[0xa8];
  adStack_10e0[0x111] = adStack_10e0[0x111] - dVar174;
  dVar60 = adStack_1480[0xf] * -0.12993945039280527;
  dVar32 = adStack_1480[3] * adStack_1480[9] * 0.0 +
           (0.0 - ((dStack_12e0 + dStack_1280) - (local_12d8 + local_12a8)) * 0.0006666666666666666)
           * -1.2126178147109573e-07 * adStack_1480[0xe] * adStack_1480[2];
  dVar38 = adStack_1480[10] * adStack_1480[3] * 0.0 +
           (0.0 - ((local_1278 + dStack_12e0) - (dStack_12a0 + local_12d8)) * 0.0006666666666666666)
           * -0.12993945039280527 * adStack_1480[2] * adStack_1480[0xf];
  dVar131 = adStack_1480[10] * 84300000.0;
  dVar61 = adStack_1480[3] * 84300000.0;
  dVar300 = adStack_1480[2] * -0.12993945039280527;
  dVar248 = adStack_1480[3] * adStack_1480[9] * 15000000.0 +
            adStack_1480[0xe] * adStack_1480[2] * -1.2126178147109573e-07;
  dVar268 = adStack_1480[10] * adStack_1480[3] * 84300000.0 +
            adStack_1480[2] * adStack_1480[0xf] * -0.12993945039280527;
  adStack_1480[0x1a] = auVar9._8_8_;
  dVar62 = adStack_1480[0xb] * 3309407.0851908242;
  adStack_10e0[0x21] = adStack_10e0[0x21] - dVar62;
  dVar132 = adStack_1480[10] * -141857.17388911778;
  dVar63 = adStack_1480[5] * -141857.17388911778;
  dVar203 = adStack_1480[3] * 3309407.0851908242;
  adStack_10e0[0xc9] = adStack_10e0[0xc9] - dVar203;
  dVar64 = adStack_1480[0xe] * 30000000.0;
  dVar280 = adStack_1480[0xb] * adStack_1480[3] * 9674.740273245088 +
            (0.002923405922631374 -
            ((local_12c8 + dStack_12a0) - (local_12d8 + local_1298)) * 0.0006666666666666666) *
            -141857.17388911778 * adStack_1480[5] * adStack_1480[10];
  dVar290 = adStack_1480[3] * adStack_1480[0xe] * 0.0 +
            (0.0 - ((dStack_1290 + local_12c8) - (dStack_1280 + local_12d8)) * 0.0006666666666666666
            ) * -1.316420144391347e-05 * adStack_1480[0xc] * adStack_1480[5];
  dVar65 = adStack_1480[0xc] * -1.316420144391347e-05;
  dVar133 = adStack_1480[5] * -1.316420144391347e-05;
  dVar134 = adStack_1480[3] * 30000000.0;
  dVar215 = adStack_1480[0xb] * adStack_1480[3] * 3309407.0851908242 +
            adStack_1480[5] * adStack_1480[10] * -141857.17388911778;
  dVar237 = adStack_1480[3] * adStack_1480[0xe] * 30000000.0 +
            adStack_1480[0xc] * adStack_1480[5] * -1.316420144391347e-05;
  dVar176 = adStack_1480[3] * adStack_1480[0xe] * 30000000.0 +
            adStack_1480[2] * adStack_1480[0xd] * -9.717850050148037e-07;
  dVar216 = adStack_1480[3] * adStack_1480[0xe] * 0.0 +
            (0.0 - ((dStack_12e0 + local_1288) - (local_12d8 + dStack_1280)) * 0.0006666666666666666
            ) * -9.717850050148037e-07 * adStack_1480[2] * adStack_1480[0xd];
  dVar66 = adStack_1480[0xd] * -9.717850050148037e-07;
  dVar67 = adStack_1480[0xe] * 30000000.0;
  dVar249 = adStack_1480[2] * -9.717850050148037e-07;
  adStack_10e0[0x100] = adStack_10e0[0x100] - dVar249;
  dVar68 = adStack_1480[3] * 30000000.0;
  adStack_10e0[0x115] = adStack_10e0[0x115] + dVar68;
  dVar177 = adStack_1480[3] * adStack_1480[0xf] * 11893241.704910735 +
            adStack_1480[5] * adStack_1480[0xe] * -2811.709768791155;
  dVar217 = adStack_1480[3] * adStack_1480[0xf] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((local_12c8 + dStack_1280) - (local_12d8 + local_1278)) * 0.0006666666666666666) *
            -2811.709768791155 * adStack_1480[5] * adStack_1480[0xe];
  dVar69 = adStack_1480[0xf] * 11893241.704910735;
  dVar70 = adStack_1480[0xe] * -2811.709768791155;
  dVar170 = adStack_1480[5] * -2811.709768791155;
  dVar250 = adStack_1480[3] * 11893241.704910735;
  dVar71 = adStack_1480[0x11] * 11574309.207109384;
  adStack_10e0[0x24] =
       (((dVar130 + dVar129 + adStack_10e0[0x24]) - dVar64) - dVar67) + dVar69 + dVar71;
  adStack_10e0[0x27] = adStack_10e0[0x27] - dVar71;
  dVar135 = adStack_1480[0xe] * -14.898178128775022;
  dVar72 = adStack_1480[10] * -14.898178128775022;
  adStack_10e0[0x10b] =
       (((((adStack_10e0[0x10b] - dVar314) - dVar174) - dVar134) - dVar68) - dVar170) - dVar72;
  adStack_10e0[0x119] = adStack_10e0[0x119] - dVar72;
  dVar33 = adStack_1480[3] * 11574309.207109384;
  adStack_10e0[0x14d] = adStack_10e0[0x14d] - dVar33;
  adStack_10e0[0x158] = adStack_10e0[0x158] + dVar33;
  dVar73 = adStack_1480[0x12] * 132000000.0;
  dVar281 = adStack_1480[0x11] * adStack_1480[3] * 14690.152683074684 +
            (0.0012692034073231281 -
            ((dStack_12a0 + dStack_1280) - (local_12d8 + local_1268)) * 0.0006666666666666666) *
            -14.898178128775022 * adStack_1480[10] * adStack_1480[0xe];
  dVar291 = adStack_1480[3] * adStack_1480[0x12] * 0.0 +
            (0.0 - ((local_1278 + dStack_12a0) - (dStack_1260 + local_12d8)) * 0.0006666666666666666
            ) * -0.00037751521951089154 * adStack_1480[0xf] * adStack_1480[10];
  adStack_10e0[0x25] = ((dVar131 + adStack_10e0[0x25]) - dVar69) + dVar73;
  dVar74 = adStack_1480[0xf] * -0.00037751521951089154;
  dVar136 = adStack_1480[10] * -0.00037751521951089154;
  adStack_10e0[0x121] = ((adStack_10e0[0x121] - dVar300) - dVar250) - dVar136;
  adStack_10e0[0x130] = adStack_10e0[0x130] - dVar136;
  dVar315 = adStack_1480[3] * 132000000.0;
  adStack_10e0[0x16f] = adStack_10e0[0x16f] + dVar315;
  dVar218 = adStack_1480[0x11] * adStack_1480[3] * 11574309.207109384 +
            adStack_1480[10] * adStack_1480[0xe] * -14.898178128775022;
  dVar238 = adStack_1480[3] * adStack_1480[0x12] * 132000000.0 +
            adStack_1480[0xf] * adStack_1480[10] * -0.00037751521951089154;
  dVar178 = adStack_1480[3] * adStack_1480[0x13] * 16686316.432824839 +
            adStack_1480[5] * adStack_1480[0x12] * -64695.71318864056;
  dVar219 = adStack_1480[3] * adStack_1480[0x13] * 42593.141495423035 +
            (0.00255257903485727 -
            ((local_12c8 + dStack_1260) - (local_12d8 + local_1258)) * 0.0006666666666666666) *
            -64695.71318864056 * adStack_1480[5] * adStack_1480[0x12];
  dVar75 = adStack_1480[0x13] * 16686316.432824839;
  adStack_10e0[0x28] = (adStack_10e0[0x28] - dVar73) + dVar75;
  adStack_10e0[0x29] = adStack_10e0[0x29] - dVar75;
  dVar76 = adStack_1480[0x12] * -64695.71318864056;
  dVar34 = adStack_1480[5] * -64695.71318864056;
  adStack_10e0[0x163] = (adStack_10e0[0x163] - dVar315) - dVar34;
  dVar171 = adStack_1480[3] * 16686316.432824839;
  adStack_10e0[0x179] = adStack_10e0[0x179] - dVar171;
  dVar77 = adStack_1480[0xd] * -0.32764529688590877;
  adStack_10e0[0x22] = (adStack_10e0[0x22] + dVar64) - dVar77;
  adStack_10e0[0x23] = dVar77 + adStack_10e0[0x23] + dVar67;
  dVar137 = adStack_1480[0xc] * 0.2714339464219018;
  adStack_10e0[0x39] = dVar137 + adStack_10e0[0x39];
  dVar78 = adStack_1480[4] * 0.2714339464219018;
  adStack_10e0[0xdf] = (adStack_10e0[0xdf] - dVar133) + dVar78;
  dVar251 = adStack_1480[3] * -0.32764529688590877;
  adStack_10e0[0xf5] = (adStack_10e0[0xf5] - dVar249) + dVar251;
  adStack_10e0[0xf6] = adStack_10e0[0xf6] - dVar251;
  dVar325 = adStack_1480[0xf] * 148.64629960980085;
  dVar138 = adStack_1480[0xe] * -1595994.8383312945;
  dVar79 = adStack_1480[7] * -1595994.8383312945;
  dVar252 = adStack_1480[4] * 148.64629960980085;
  dVar282 = adStack_1480[4] * adStack_1480[0xc] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((local_12d8 + local_1288) - (dStack_12d0 + dStack_1290)) * 0.0006666666666666666) *
            -0.32764529688590877 * adStack_1480[3] * adStack_1480[0xd];
  dVar292 = adStack_1480[0xf] * adStack_1480[4] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((local_12b8 + dStack_1280) - (local_1278 + dStack_12d0)) * 0.0006666666666666666) *
            -1595994.8383312945 * adStack_1480[7] * adStack_1480[0xe];
  dVar199 = adStack_1480[4] * adStack_1480[0xc] * 0.2714339464219018 +
            adStack_1480[3] * adStack_1480[0xd] * -0.32764529688590877;
  dVar26 = adStack_1480[0xf] * adStack_1480[4] * 148.64629960980085 +
           adStack_1480[7] * adStack_1480[0xe] * -1595994.8383312945;
  adStack_1480[0x1e] = auVar10._8_8_;
  dVar301 = adStack_1480[4] * 659416.0587695736;
  adStack_10e0[3] = dVar301 + (((((adStack_10e0[3] - dVar55) - dVar56) - dVar58) - dVar60) - dVar66)
  ;
  dVar139 = adStack_1480[5] * -10782603.17894348;
  dVar283 = adStack_1480[2] * 659416.0587695736;
  adStack_10e0[0x18] =
       (adStack_10e0[0x18] + dVar125 + dVar129 + dVar130 + dVar131 + dVar67) - dVar139;
  dVar80 = adStack_1480[3] * -10782603.17894348;
  dVar140 = adStack_1480[4] * -0.4971315070618765;
  local_1170 = local_1170 + dVar140;
  local_1158 = local_1158 - dVar140;
  dVar179 = adStack_1480[7] * 19568365.243600544;
  dVar326 = adStack_1480[1] * -0.4971315070618765;
  adStack_10e0[0x2d] = adStack_10e0[0x2d] + dVar326;
  dVar141 = adStack_1480[2] * 19568365.243600544;
  adStack_10e0[0x6f] = adStack_10e0[0x6f] + dVar141;
  dVar81 = adStack_1480[2] * adStack_1480[7] * 4674.103192900765 +
           (0.00023886017736864045 -
           ((dStack_12d0 + local_12e8) - (local_12b8 + dStack_12e0)) * 0.0006666666666666666) *
           -0.4971315070618765 * adStack_1480[4] * adStack_1480[1];
  dVar124 = adStack_1480[4] * adStack_1480[2] * 2125.623798113147 +
            (0.0032234941352193023 -
            ((local_12d8 + local_12c8) - (dStack_12e0 + dStack_12d0)) * 0.0006666666666666666) *
            -10782603.17894348 * adStack_1480[3] * adStack_1480[5];
  dVar205 = adStack_1480[2] * adStack_1480[7] * 19568365.243600544 +
            adStack_1480[4] * adStack_1480[1] * -0.4971315070618765;
  dVar27 = adStack_1480[4] * adStack_1480[2] * 659416.0587695736 +
           adStack_1480[3] * adStack_1480[5] * -10782603.17894348;
  dVar180 = adStack_1480[2] * adStack_1480[7] * 108289848.15442011 +
            adStack_1480[5] * adStack_1480[5] * -38.98923487337139;
  dVar220 = adStack_1480[2] * adStack_1480[7] * 15379.207897229715 +
            (0.00014201892568266544 -
            ((local_12c8 + local_12c8) - (dStack_12e0 + local_12b8)) * 0.0006666666666666666) *
            -38.98923487337139 * adStack_1480[5] * adStack_1480[5];
  dVar142 = adStack_1480[7] * 108289848.15442011;
  adStack_10e0[7] = (adStack_10e0[7] - dVar179) - dVar142;
  dVar143 = adStack_1480[5] * -77.97846974674277;
  dVar82 = adStack_1480[2] * 108289848.15442011;
  adStack_10e0[0x70] = (adStack_10e0[0x70] - dVar141) - dVar82;
  dVar144 = adStack_1480[10] * -120140.80184495587;
  local_1138 = local_1138 - dVar144;
  dVar145 = adStack_1480[0xb] * 2429212.6664140443;
  adStack_10e0[0xb] = adStack_10e0[0xb] - dVar145;
  dVar83 = adStack_1480[1] * -120140.80184495587;
  dVar206 = adStack_1480[2] * 2429212.6664140443;
  adStack_10e0[199] = adStack_10e0[199] + dVar206;
  adStack_10e0[200] = adStack_10e0[200] - dVar206;
  dVar84 = adStack_1480[0xc] * -3.716149717925534e-05;
  dVar284 = adStack_1480[2] * adStack_1480[0xb] * 8512.899029058015 +
            (0.003504386069921407 -
            ((local_12e8 + dStack_12a0) - (dStack_12e0 + local_1298)) * 0.0006666666666666666) *
            -120140.80184495587 * adStack_1480[10] * adStack_1480[1];
  dVar293 = adStack_1480[0xe] * adStack_1480[2] * 0.0 +
            (0.0 - ((dStack_1290 + local_12e8) - (dStack_1280 + dStack_12e0)) *
                   0.0006666666666666666) * -3.716149717925534e-05 *
            adStack_1480[1] * adStack_1480[0xc];
  local_1130 = local_1130 + dVar84;
  dVar146 = adStack_1480[0xe] * 73400000.0;
  dVar316 = adStack_1480[1] * -3.716149717925534e-05;
  adStack_10e0[0xdd] = adStack_10e0[0xdd] + dVar316;
  dVar85 = adStack_1480[2] * 73400000.0;
  dVar221 = adStack_1480[2] * adStack_1480[0xb] * 2429212.6664140443 +
            adStack_1480[10] * adStack_1480[1] * -120140.80184495587;
  dVar239 = adStack_1480[0xe] * adStack_1480[2] * 73400000.0 +
            adStack_1480[1] * adStack_1480[0xc] * -3.716149717925534e-05;
  dVar147 = adStack_1480[2] * adStack_1480[0xf] * 16575581.576889673 +
            adStack_1480[1] * adStack_1480[0xe] * -4521.295558798051;
  dVar222 = adStack_1480[2] * adStack_1480[0xf] * 23743.85449528333 +
            (0.0014324598135602037 -
            ((local_12e8 + dStack_1280) - (dStack_12e0 + local_1278)) * 0.0006666666666666666) *
            -4521.295558798051 * adStack_1480[1] * adStack_1480[0xe];
  dVar86 = adStack_1480[0xe] * -4521.295558798051;
  local_1120 = (local_1120 - dVar84) + dVar86;
  local_1118 = local_1118 - dVar86;
  dVar87 = adStack_1480[0xf] * 16575581.576889673;
  adStack_10e0[0xe] = (((dVar58 + dVar56 + adStack_10e0[0xe]) - dVar66) - dVar146) + dVar87;
  dVar207 = adStack_1480[1] * -4521.295558798051;
  adStack_10e0[0x109] = adStack_10e0[0x109] + dVar85 + dVar207;
  adStack_10e0[0x10a] = ((adStack_10e0[0x10a] + dVar314 + dVar174 + dVar68) - dVar85) - dVar207;
  dVar253 = adStack_1480[2] * 16575581.576889673;
  adStack_10e0[0x11f] = adStack_10e0[0x11f] + dVar253;
  dVar181 = adStack_1480[2] * adStack_1480[0x10] * 32000000.0 +
            adStack_1480[5] * adStack_1480[10] * -10291.734087429853;
  dVar223 = adStack_1480[2] * adStack_1480[0x10] * 0.0 +
            (0.0 - ((local_12c8 + dStack_12a0) - (dStack_12e0 + dStack_1270)) *
                   0.0006666666666666666) * -10291.734087429853 * adStack_1480[5] * adStack_1480[10]
  ;
  dVar88 = adStack_1480[0x10] * 32000000.0;
  adStack_10e0[0x10] = adStack_10e0[0x10] - dVar88;
  dVar89 = adStack_1480[10] * -10291.734087429853;
  dVar214 = adStack_1480[5] * -10291.734087429853;
  dVar254 = adStack_1480[2] * 32000000.0;
  adStack_10e0[0x136] = adStack_10e0[0x136] - dVar254;
  dVar148 = adStack_1480[2] * adStack_1480[0x13] * 9958163.265843963 +
            adStack_1480[1] * adStack_1480[0x12] * -44546.96801065157;
  dVar224 = adStack_1480[2] * adStack_1480[0x13] * 29384.200706874846 +
            (0.0029507651082264627 -
            ((local_12e8 + dStack_1260) - (dStack_12e0 + local_1258)) * 0.0006666666666666666) *
            -44546.96801065157 * adStack_1480[1] * adStack_1480[0x12];
  dVar90 = adStack_1480[0x12] * -44546.96801065157;
  local_1100 = local_1100 + dVar90;
  local_10f8[0] = local_10f8[0] - dVar90;
  dVar91 = adStack_1480[0x13] * 9958163.265843963;
  adStack_10e0[0x13] = adStack_10e0[0x13] - dVar91;
  dVar244 = adStack_1480[1] * -44546.96801065157;
  adStack_10e0[0x161] = adStack_10e0[0x161] + dVar244;
  dVar255 = adStack_1480[2] * 9958163.265843963;
  adStack_10e0[0x177] = adStack_10e0[0x177] + dVar255;
  adStack_10e0[0x178] = adStack_10e0[0x178] - dVar255;
  dVar256 = adStack_1480[1] * adStack_1480[5] * 4271828.084344627 +
            adStack_1480[2] * adStack_1480[6] * -121922.904977942;
  dVar225 = adStack_1480[1] * adStack_1480[5] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((dStack_12e0 + dStack_12c0) - (local_12e8 + local_12c8)) * 0.0006666666666666666) *
            -121922.904977942 * adStack_1480[2] * adStack_1480[6];
  dVar92 = adStack_1480[5] * 4271828.084344627;
  local_1168 = (dVar208 + local_1168) - dVar92;
  local_1160 = dVar92 + local_1160;
  dVar93 = adStack_1480[6] * -121922.904977942;
  adStack_10e0[6] = dVar93 + adStack_10e0[6];
  dVar35 = adStack_1480[1] * 4271828.084344627;
  adStack_10e0[0x43] = (adStack_10e0[0x43] - dVar175) - dVar35;
  dVar173 = adStack_1480[2] * -121922.904977942;
  adStack_10e0[0x59] = adStack_10e0[0x59] - dVar173;
  adStack_10e0[0x5a] = adStack_10e0[0x5a] + dVar173;
  dVar257 = adStack_1480[5] * adStack_1480[5] * 3038827.9270273494 +
            adStack_1480[3] * adStack_1480[6] * -100069.45216403608;
  dVar226 = adStack_1480[5] * adStack_1480[5] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((local_12d8 + dStack_12c0) - (local_12c8 + local_12c8)) * 0.0006666666666666666) *
            -100069.45216403608 * adStack_1480[3] * adStack_1480[6];
  dVar149 = adStack_1480[6] * -100069.45216403608;
  adStack_10e0[0x1b] =
       (dVar307 + dVar125 + adStack_10e0[0x1b] + dVar62 + dVar64 + dVar69 + dVar75 + dVar139) -
       (dVar149 + dVar149);
  adStack_10e0[0x1c] = dVar149 + adStack_10e0[0x1c];
  dVar150 = adStack_1480[5] * 6077655.854054699;
  adStack_10e0[0x45] =
       dVar80 + ((((((adStack_10e0[0x45] - dVar175) - dVar308) - dVar132) - dVar65) - dVar70) -
                dVar76) + dVar150;
  dVar245 = adStack_1480[3] * -100069.45216403608;
  adStack_10e0[0x5b] = adStack_10e0[0x5b] + dVar245;
  dVar302 = adStack_1480[6] * -0.024867627282709664;
  dVar182 = adStack_1480[7] * 34296205.4093863;
  dVar309 = dVar150 + dVar35 + adStack_10e0[0x48] + dVar182;
  dVar198 = ((adStack_10e0[0x49] - dVar308) - dVar143) - dVar182;
  auVar11._8_4_ = SUB84(dVar198,0);
  auVar11._0_8_ = dVar309;
  auVar11._12_4_ = (int)((ulong)dVar198 >> 0x20);
  dVar36 = adStack_1480[4] * -0.024867627282709664;
  adStack_10e0[0x5f] = adStack_10e0[0x5f] - dVar36;
  dVar151 = adStack_1480[5] * 34296205.4093863;
  adStack_10e0[0x74] = adStack_10e0[0x74] + dVar151;
  dVar121 = adStack_1480[0xf] * -0.029479148639814108;
  dVar327 = adStack_1480[8] * adStack_1480[5] * 20000000.0 +
            adStack_1480[0xf] * adStack_1480[2] * -0.029479148639814108;
  dVar329 = adStack_1480[5] * adStack_1480[7] * 34296205.4093863 +
            adStack_1480[6] * adStack_1480[4] * -0.024867627282709664;
  dVar152 = adStack_1480[8] * 20000000.0;
  dVar153 = adStack_1480[5] * 20000000.0;
  dVar317 = adStack_1480[2] * -0.029479148639814108;
  dVar321 = adStack_1480[8] * adStack_1480[5] * 0.0 +
            (0.0 - ((local_1278 + dStack_12e0) - (dStack_12b0 + local_12c8)) * 0.0006666666666666666
            ) * -0.029479148639814108 * adStack_1480[0xf] * adStack_1480[2];
  dVar324 = adStack_1480[5] * adStack_1480[7] * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((dStack_12c0 + dStack_12d0) - (local_12c8 + local_12b8)) * 0.0006666666666666666) *
            -0.024867627282709664 * adStack_1480[6] * adStack_1480[4];
  dVar198 = (((adStack_1480[0x1d] + dVar26) - dVar205) - dVar180) - dVar329;
  auVar12._8_4_ = SUB84(adStack_1480[0x1e] - dVar327,0);
  auVar12._0_8_ = dVar198;
  auVar12._12_4_ = (int)((ulong)(adStack_1480[0x1e] - dVar327) >> 0x20);
  dVar154 = adStack_1480[0xf] * -0.001025849604117461;
  adStack_10e0[0xf] = dVar154 + dVar121 + ((dVar60 + adStack_10e0[0xf]) - dVar87);
  dVar155 = adStack_1480[9] * 30000000.0;
  dVar156 = adStack_1480[5] * 30000000.0;
  dVar227 = adStack_1480[2] * -0.001025849604117461;
  adStack_10e0[0x120] = ((adStack_10e0[0x120] + dVar300) - dVar253) + dVar317 + dVar227;
  dVar94 = adStack_1480[10] * 1097137.153737377;
  dVar285 = adStack_1480[10] * adStack_1480[5] * 2500.221646810261 +
            (0.00227885970162737 -
            ((dStack_12b0 + dStack_12c0) - (dStack_12a0 + local_12c8)) * 0.0006666666666666666) *
            -37781.99143773652 * adStack_1480[8] * adStack_1480[6];
  dVar294 = adStack_1480[5] * adStack_1480[9] * 0.0 +
            (0.0 - ((local_1278 + dStack_12e0) - (local_12c8 + local_12a8)) * 0.0006666666666666666)
            * -0.001025849604117461 * adStack_1480[0xf] * adStack_1480[2];
  dVar258 = adStack_1480[10] * adStack_1480[5] * 1097137.153737377 +
            adStack_1480[8] * adStack_1480[6] * -37781.99143773652;
  dVar269 = adStack_1480[5] * adStack_1480[9] * 30000000.0 +
            adStack_1480[0xf] * adStack_1480[2] * -0.001025849604117461;
  adStack_10e0[0x49] = auVar11._8_8_;
  dVar157 = adStack_1480[8] * -37781.99143773652;
  dVar95 = adStack_1480[6] * -37781.99143773652;
  adStack_10e0[0x8a] = adStack_10e0[0x8a] + dVar95;
  dVar310 = adStack_1480[5] * 1097137.153737377;
  adStack_1480[0x1e] = auVar12._8_8_;
  dVar183 = adStack_1480[5] * adStack_1480[10] * 25010000.0 +
            adStack_1480[6] * adStack_1480[9] * -37124457.44676649;
  dVar228 = adStack_1480[5] * adStack_1480[10] * 0.0 +
            (0.0 - ((dStack_12c0 + local_12a8) - (local_12c8 + dStack_12a0)) * 0.0006666666666666666
            ) * -37124457.44676649 * adStack_1480[6] * adStack_1480[9];
  dVar96 = adStack_1480[10] * 25010000.0;
  dVar97 = adStack_1480[9] * -37124457.44676649;
  dVar246 = adStack_1480[6] * -37124457.44676649;
  dVar259 = adStack_1480[5] * 25010000.0;
  dVar158 = adStack_1480[0xb] * 4238127.66170656;
  adStack_10e0[0x4d] = (adStack_10e0[0x4d] - dVar132) - dVar158;
  dVar159 = adStack_1480[10] * -5982.3326554224905;
  adStack_10e0[0x62] = ((adStack_10e0[0x62] - dVar157) - dVar97) + dVar159;
  adStack_10e0[99] = adStack_10e0[99] - dVar159;
  dVar184 = adStack_1480[6] * -5982.3326554224905;
  adStack_10e0[0xb6] = adStack_10e0[0xb6] + dVar310 + dVar259 + dVar184;
  dVar260 = adStack_1480[5] * 4238127.66170656;
  adStack_10e0[0xcb] = (adStack_10e0[0xcb] + dVar203) - dVar260;
  adStack_10e0[0xcc] = adStack_10e0[0xcc] + dVar260;
  dVar98 = adStack_1480[0xd] * -27278.71839873273;
  dVar261 = adStack_1480[5] * adStack_1480[0xc] * 308.3061146970958 +
            (0.0008343222962694802 -
            ((local_1288 + dStack_12e0) - (dStack_1290 + local_12c8)) * 0.0006666666666666666) *
            -27278.71839873273 * adStack_1480[0xd] * adStack_1480[2];
  dVar270 = adStack_1480[0xb] * adStack_1480[5] * 7478.008612521503 +
            (0.0017644604432492119 -
            ((dStack_12a0 + dStack_12c0) - (local_12c8 + local_1298)) * 0.0006666666666666666) *
            -5982.3326554224905 * adStack_1480[10] * adStack_1480[6];
  dVar229 = adStack_1480[5] * adStack_1480[0xc] * 369528.79729527823 +
            adStack_1480[0xd] * adStack_1480[2] * -27278.71839873273;
  dVar240 = adStack_1480[0xb] * adStack_1480[5] * 4238127.66170656 +
            adStack_1480[10] * adStack_1480[6] * -5982.3326554224905;
  adStack_10e0[0xd] = dVar98 + adStack_10e0[0xd] + dVar66;
  dVar185 = adStack_1480[0xc] * 369528.79729527823;
  dVar160 = adStack_1480[5] * 369528.79729527823;
  dVar303 = adStack_1480[2] * -27278.71839873273;
  adStack_10e0[0xf4] = adStack_10e0[0xf4] + dVar249 + dVar303;
  dVar99 = adStack_1480[0xe] * 50000000.0;
  dVar100 = adStack_1480[0xc] * -7.225013822780462e-07;
  dVar161 = adStack_1480[6] * -7.225013822780462e-07;
  dVar247 = adStack_1480[5] * 50000000.0;
  dVar318 = (((((((((dVar180 + dVar180 +
                     dVar200 + dVar201 + adStack_1480[0x1b] + dVar215 + dVar237 + dVar177 + dVar178
                     + dVar27 + dVar181) - dVar256) - (dVar257 + dVar257)) - dVar329) - dVar327) -
               dVar269) - dVar258) - dVar183) - dVar240) - dVar229;
  dVar200 = dVar329 + dVar256 + adStack_1480[0x1c] + dVar257 + dVar258 + dVar183 + dVar240;
  dVar286 = adStack_1480[5] * adStack_1480[0xf] * 22295026.02480445 +
            adStack_1480[0xe] * adStack_1480[6] * -173.56959160214726;
  dVar295 = adStack_1480[0xe] * adStack_1480[5] * 50000000.0 +
            adStack_1480[6] * adStack_1480[0xc] * -7.225013822780462e-07;
  auVar29._8_4_ = SUB84(dVar200,0);
  auVar29._0_8_ = dVar318;
  auVar29._12_4_ = (int)((ulong)dVar200 >> 0x20);
  dVar162 = adStack_1480[0xf] * 22295026.02480445;
  dVar186 = adStack_1480[0xe] * -173.56959160214726;
  adStack_10e0[0x66] = (adStack_10e0[0x66] - dVar100) + dVar186;
  adStack_10e0[0x67] = adStack_10e0[0x67] - dVar186;
  dVar163 = adStack_1480[6] * -173.56959160214726;
  adStack_10e0[0x10e] = adStack_10e0[0x10e] + dVar247 + dVar163;
  dVar230 = adStack_1480[5] * 22295026.02480445;
  adStack_10e0[0x124] = adStack_10e0[0x124] + dVar230;
  dVar304 = adStack_1480[5] * adStack_1480[0xf] * 15309.867045680163 +
            (0.0006866942890601289 -
            ((dStack_1280 + dStack_12c0) - (local_1278 + local_12c8)) * 0.0006666666666666666) *
            -173.56959160214726 * adStack_1480[0xe] * adStack_1480[6];
  dVar306 = adStack_1480[0xe] * adStack_1480[5] * 0.0 +
            (0.0 - ((dStack_12c0 + dStack_1290) - (local_12c8 + dStack_1280)) *
                   0.0006666666666666666) * -7.225013822780462e-07 *
            adStack_1480[6] * adStack_1480[0xc];
  dVar200 = dVar306 + ((dVar293 + ((dVar290 + dStack_2c0 + dVar54) - dVar282)) - dVar261);
  dVar127 = dVar261 + local_2b8 + dVar216 + dVar282;
  auVar13._8_4_ = SUB84(dVar127,0);
  auVar13._0_8_ = dVar200;
  auVar13._12_4_ = (int)((ulong)dVar127 >> 0x20);
  adStack_1480[0x1c] = auVar29._8_8_;
  dVar101 = adStack_1480[0x13] * 14307411.985466668;
  adStack_10e0[0x54] = adStack_10e0[0x54] + dVar76 + dVar101;
  adStack_10e0[0x55] = (adStack_10e0[0x55] - dVar76) - dVar101;
  dVar164 = adStack_1480[0x12] * -1826.7180743084757;
  adStack_10e0[0x5d] =
       ((((((((adStack_10e0[0x5d] - dVar173) - (dVar245 + dVar245)) - dVar36) - dVar157) - dVar97) -
         dVar159) - dVar100) - dVar186) - dVar164;
  adStack_10e0[0x6a] = adStack_10e0[0x6a] + dVar164;
  adStack_10e0[0x6b] = adStack_10e0[0x6b] - dVar164;
  dVar102 = adStack_1480[6] * -1826.7180743084757;
  adStack_10e0[0x165] = (adStack_10e0[0x165] + dVar34) - dVar102;
  adStack_10e0[0x166] = adStack_10e0[0x166] + dVar102;
  dVar262 = adStack_1480[5] * 14307411.985466668;
  adStack_10e0[0x17b] = (adStack_10e0[0x17b] + dVar171) - dVar262;
  adStack_10e0[0x17c] = adStack_10e0[0x17c] + dVar262;
  dVar187 = adStack_1480[0xf] * -1.061382456225949e-08;
  dVar188 = adStack_1480[8] * 20000000.0;
  adStack_10e0[0x76] = adStack_10e0[0x76] - dVar188;
  dVar189 = adStack_1480[7] * 20000000.0;
  adStack_10e0[0x8b] = adStack_10e0[0x8b] - dVar189;
  dVar322 = adStack_1480[5] * -1.061382456225949e-08;
  adStack_10e0[0x93] = dVar189 + dVar153 + adStack_10e0[0x93];
  adStack_10e0[0x126] = (adStack_10e0[0x126] - dVar317) - dVar322;
  dVar263 = adStack_1480[8] * adStack_1480[7] * 0.0 +
            (0.0 - ((local_1278 + local_12c8) - (dStack_12b0 + local_12b8)) * 0.0006666666666666666)
            * -1.061382456225949e-08 * adStack_1480[0xf] * adStack_1480[5];
  dVar271 = adStack_1480[0x13] * adStack_1480[5] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((dStack_1260 + dStack_12c0) - (local_1258 + local_12c8)) * 0.0006666666666666666) *
            -1826.7180743084757 * adStack_1480[0x12] * adStack_1480[6];
  dVar231 = adStack_1480[8] * adStack_1480[7] * 20000000.0 +
            adStack_1480[0xf] * adStack_1480[5] * -1.061382456225949e-08;
  dVar241 = adStack_1480[0x13] * adStack_1480[5] * 14307411.985466668 +
            adStack_1480[0x12] * adStack_1480[6] * -1826.7180743084757;
  dVar103 = adStack_1480[0xb] * -0.5136789314491079;
  adStack_10e0[0x37] = dVar103 + adStack_10e0[0x37];
  dVar165 = adStack_1480[10] * 1000000.0;
  dVar104 = adStack_1480[7] * 1000000.0;
  adStack_10e0[0x79] = dVar165 + adStack_10e0[0x79];
  dVar122 = adStack_1480[4] * -0.5136789314491079;
  adStack_10e0[0xca] = adStack_10e0[0xca] + dVar122;
  adStack_10e0[0xcd] = adStack_10e0[0xcd] - dVar122;
  dVar105 = adStack_1480[0x10] * -22389.705712050265;
  adStack_10e0[0x52] = dVar105 + (adStack_10e0[0x52] - dVar89);
  dVar106 = adStack_1480[10] * 20000000.0;
  adStack_10e0[0x78] = (adStack_10e0[0x78] - dVar165) - dVar106;
  dVar209 = adStack_1480[7] * 20000000.0;
  adStack_10e0[0xb7] = (adStack_10e0[0xb7] - dVar104) - dVar209;
  dVar328 = adStack_1480[5] * -22389.705712050265;
  adStack_10e0[0x139] = adStack_10e0[0x139] + dVar254 + dVar328;
  dVar311 = adStack_1480[10] * adStack_1480[7] * 0.0 +
            (0.0 - ((local_12c8 + dStack_1270) - (dStack_12a0 + local_12b8)) * 0.0006666666666666666
            ) * -22389.705712050265 * adStack_1480[5] * adStack_1480[0x10];
  dVar312 = adStack_1480[7] * adStack_1480[10] * 0.0 +
            (0.0 - ((dStack_12d0 + local_1298) - (local_12b8 + dStack_12a0)) * 0.0006666666666666666
            ) * -0.5136789314491079 * adStack_1480[4] * adStack_1480[0xb];
  dVar127 = ((((((local_2e8 - dVar305) + dVar292) - dVar81) - dVar220) - dVar324) - dVar263) -
            dVar312;
  dVar172 = (((dStack_2e0 - dVar299) - dVar321) + dVar285) - dVar263;
  auVar14._8_4_ = SUB84(dVar172,0);
  auVar14._0_8_ = dVar127;
  auVar14._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar25 = adStack_1480[10] * adStack_1480[7] * 20000000.0 +
           adStack_1480[5] * adStack_1480[0x10] * -22389.705712050265;
  dVar28 = adStack_1480[7] * adStack_1480[10] * 1000000.0 +
           adStack_1480[4] * adStack_1480[0xb] * -0.5136789314491079;
  dVar198 = (dVar198 - dVar231) - dVar28;
  dVar172 = (adStack_1480[0x1e] + dVar258) - dVar231;
  auVar15._8_4_ = SUB84(dVar172,0);
  auVar15._0_8_ = dVar198;
  auVar15._12_4_ = (int)((ulong)dVar172 >> 0x20);
  adStack_1480[0x1e] = auVar15._8_8_;
  dStack_2e0 = auVar14._8_8_;
  dVar107 = adStack_1480[0xd] * -0.001452763170659347;
  adStack_10e0[0x49] = ((adStack_10e0[0x49] - dVar187) - dVar105) - dVar107;
  adStack_10e0[0x48] = dVar309 + dVar94 + dVar96 + dVar158 + dVar99 + dVar162 + dVar101;
  adStack_10e0[0x4f] = dVar107 + dVar185 + adStack_10e0[0x4f];
  dVar166 = adStack_1480[0xc] * 54659.06262097068;
  adStack_10e0[0x73] =
       ((dVar82 + dVar82 + dVar202 + adStack_10e0[0x73]) - dVar151) + dVar188 + dVar106 + dVar166;
  adStack_10e0[0x7b] = dVar166 + adStack_10e0[0x7b];
  dVar108 = adStack_1480[7] * 54659.06262097068;
  dVar119 = adStack_1480[5] * -0.001452763170659347;
  adStack_10e0[0xf7] = (adStack_10e0[0xf7] - dVar303) + dVar119;
  adStack_10e0[0xf9] = adStack_10e0[0xf9] - dVar119;
  dVar109 = adStack_1480[8] * 7980492.798776164;
  dVar287 = adStack_1480[7] * adStack_1480[0xc] * 288.5005730915626 +
            (0.005278183694662841 -
            ((local_12c8 + local_1288) - (dStack_1290 + local_12b8)) * 0.0006666666666666666) *
            -0.001452763170659347 * adStack_1480[5] * adStack_1480[0xd];
  dVar296 = adStack_1480[4] * adStack_1480[8] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((dStack_1280 + local_12c8) - (dStack_12b0 + dStack_12d0)) * 0.0006666666666666666) *
            -4.547251755334367e-05 * adStack_1480[0xe] * adStack_1480[5];
  adStack_10e0[0x34] = adStack_10e0[0x34] - dVar109;
  dVar167 = adStack_1480[0xe] * -4.547251755334367e-05;
  adStack_10e0[0x4a] = (((adStack_10e0[0x4a] - dVar152) + dVar94) - dVar187) - dVar167;
  adStack_10e0[0x50] = dVar167 + (((adStack_10e0[0x50] - dVar65) + dVar70) - dVar99) + dVar162;
  dVar319 = adStack_1480[4] * 7980492.798776164;
  adStack_10e0[0x88] = adStack_10e0[0x88] - dVar319;
  adStack_10e0[0x89] = ((adStack_10e0[0x89] - dVar153) - dVar95) + dVar189 + dVar319;
  dVar323 = adStack_1480[5] * -4.547251755334367e-05;
  adStack_10e0[0x92] = dVar319 + dVar57 + adStack_10e0[0x92];
  adStack_10e0[0x10d] = (((adStack_10e0[0x10d] + dVar134 + dVar170) - dVar247) - dVar163) + dVar323;
  adStack_10e0[0x110] = (adStack_10e0[0x110] - dVar314) - dVar323;
  dVar232 = adStack_1480[7] * adStack_1480[0xc] * 54659.06262097068 +
            adStack_1480[5] * adStack_1480[0xd] * -0.001452763170659347;
  dVar242 = adStack_1480[4] * adStack_1480[8] * 7980492.798776164 +
            adStack_1480[0xe] * adStack_1480[5] * -4.547251755334367e-05;
  local_2b8 = auVar13._8_8_;
  dVar233 = adStack_1480[1] * adStack_1480[8] * 99487.69671959426 +
            adStack_1480[2] * adStack_1480[10] * -82454.99861437384;
  dVar210 = adStack_1480[1] * adStack_1480[8] * 293.5221550217246 +
            (0.0029503362194525 -
            ((dStack_12e0 + dStack_12a0) - (local_12e8 + dStack_12b0)) * 0.0006666666666666666) *
            -82454.99861437384 * adStack_1480[2] * adStack_1480[10];
  dVar110 = adStack_1480[8] * 99487.69671959426;
  local_1150 = local_1150 - dVar110;
  dVar111 = adStack_1480[10] * -82454.99861437384;
  dVar309 = adStack_1480[1] * 99487.69671959426;
  adStack_10e0[0x85] = adStack_10e0[0x85] - dVar309;
  dVar264 = adStack_1480[2] * -82454.99861437384;
  dVar112 = adStack_1480[0x11] * -10.82871927173647;
  adStack_10e0[8] = (((adStack_10e0[8] - dVar56) - dVar121) - dVar111) - dVar112;
  dVar168 = adStack_1480[10] * 40000000.0;
  adStack_10e0[0x86] = adStack_10e0[0x86] + dVar57 + dVar153 + dVar309 + dVar168;
  adStack_10e0[0x95] = dVar168 + adStack_10e0[0x95];
  dVar113 = adStack_1480[8] * 40000000.0;
  dVar37 = adStack_1480[2] * -10.82871927173647;
  adStack_10e0[0x152] = adStack_10e0[0x152] - dVar37;
  dVar114 = adStack_1480[0xb] * 345311.0578145205;
  dVar288 = adStack_1480[10] * adStack_1480[8] * 0.0 +
            (0.0 - ((dStack_12e0 + local_1268) - (dStack_12b0 + dStack_12a0)) *
                   0.0006666666666666666) * -10.82871927173647 *
            adStack_1480[0x11] * adStack_1480[2];
  dVar297 = adStack_1480[8] * adStack_1480[0xb] * 1099.1023565570054 +
            (0.003182934144980015 -
            ((dStack_12a0 + dStack_12a0) - (dStack_12b0 + local_1298)) * 0.0006666666666666666) *
            -14154.126978189057 * adStack_1480[10] * adStack_1480[10];
  adStack_10e0[0x8e] = dVar114 + dVar114 + ((dVar309 + (adStack_10e0[0x8e] - dVar95)) - dVar168);
  dVar115 = adStack_1480[10] * -28308.253956378114;
  adStack_10e0[0x8f] = adStack_10e0[0x8f] - dVar114;
  adStack_10e0[0xb8] = (((adStack_10e0[0xb8] + dVar310) - dVar264) - dVar113) - dVar115;
  dVar320 = adStack_1480[8] * 345311.0578145205;
  adStack_10e0[0xce] = adStack_10e0[0xce] - dVar320;
  dVar234 = adStack_1480[10] * adStack_1480[8] * 40000000.0 +
            adStack_1480[0x11] * adStack_1480[2] * -10.82871927173647;
  dVar243 = adStack_1480[8] * adStack_1480[0xb] * 345311.0578145205 +
            adStack_1480[10] * adStack_1480[10] * -14154.126978189057;
  dVar190 = adStack_1480[9] * adStack_1480[0x14] * 12265169.958139507 +
            adStack_1480[0x14] * adStack_1480[8] * -284545.07285187626;
  dVar265 = adStack_1480[9] * adStack_1480[0x14] * 1645.8767818301812 +
            (0.00013419111088125866 -
            ((dStack_1250 + dStack_12b0) - (local_12a8 + dStack_1250)) * 0.0006666666666666666) *
            -284545.07285187626 * adStack_1480[0x14] * adStack_1480[8];
  dVar172 = adStack_1480[9] * 12265169.958139507 + adStack_1480[8] * -284545.07285187626;
  adStack_10e0[0x194] = adStack_10e0[0x194] + dVar172;
  adStack_10e0[0x195] = adStack_10e0[0x195] - dVar172;
  dVar191 = adStack_1480[9] * adStack_1480[0x15] * 7359101.974883704 +
            adStack_1480[0x15] * adStack_1480[8] * -170727.04371112576;
  dVar266 = adStack_1480[9] * adStack_1480[0x15] * 987.5260690981088 +
            (0.00013419111088125866 -
            ((local_1248 + dStack_12b0) - (local_12a8 + local_1248)) * 0.0006666666666666666) *
            -170727.04371112576 * adStack_1480[0x15] * adStack_1480[8];
  dVar172 = adStack_1480[9] * 7359101.974883704 + adStack_1480[8] * -170727.04371112576;
  adStack_10e0[0x1aa] = adStack_10e0[0x1aa] + dVar172;
  adStack_10e0[0x1ab] = adStack_10e0[0x1ab] - dVar172;
  dVar172 = adStack_1480[2] * adStack_1480[5] * adStack_1480[0xc];
  dVar235 = adStack_1480[4] * adStack_1480[9] * 28000000.0 + dVar172 * -7.439703734094493e-10;
  local_1240 = dVar242 + (((dVar318 - dVar295) - dVar286) - dVar241) + dVar231 + dVar25 + dVar232 +
               dVar235;
  dVar116 = adStack_1480[5] * -7.439703734094493e-10 * adStack_1480[0xc];
  adStack_10e0[4] = ((adStack_10e0[4] - dVar301) + dVar179) - dVar116;
  adStack_10e0[5] =
       (((((dVar142 + dVar142 + dVar55 + adStack_10e0[5] + dVar301 + dVar88) - dVar93) - dVar121) -
        dVar154) - dVar98) + dVar116;
  adStack_10e0[0xc] = dVar116 + ((adStack_10e0[0xc] + dVar146) - dVar98);
  dVar117 = adStack_1480[9] * 28000000.0;
  adStack_10e0[0x2e] = ((adStack_10e0[0x2e] - dVar283) - dVar326) + dVar117;
  dVar169 = adStack_1480[2] * -7.439703734094493e-10 * adStack_1480[0xc];
  adStack_10e0[0x44] =
       ((((adStack_10e0[0x44] + dVar175) - dVar80) - dVar143) - dVar89) + dVar35 + dVar152 + dVar155
       + dVar185 + dVar169;
  adStack_10e0[0x4b] = ((adStack_10e0[0x4b] - dVar155) + dVar96) - dVar169;
  adStack_10e0[0x4e] = dVar169 + ((((adStack_10e0[0x4e] + dVar65) - dVar185) + dVar99) - dVar107);
  dVar120 = adStack_1480[4] * 28000000.0;
  adStack_10e0[0x9f] = ((adStack_10e0[0x9f] - dVar156) - dVar246) + dVar120;
  dVar318 = adStack_1480[2] * -7.439703734094493e-10 * adStack_1480[5];
  adStack_10e0[0xde] = (adStack_10e0[0xde] - dVar316) + dVar160 + dVar318;
  adStack_10e0[0xe1] = (((adStack_10e0[0xe1] + dVar133) - dVar160) - dVar161) + dVar108 + dVar318;
  dVar211 = adStack_1480[4] * adStack_1480[9] * 0.0 +
            (0.0 - (((dStack_12e0 + local_12c8 + dStack_1290) - (dStack_12d0 + local_12a8)) + -1.0)
                   * 0.0006666666666666666) * -7.439703734094493e-10 * dVar172;
  dVar192 = adStack_1480[4] * adStack_1480[9] * 12000000.0 +
            adStack_1480[6] * adStack_1480[0xc] * -2.2921694105207742e-20;
  dVar212 = adStack_1480[4] * adStack_1480[9] * 0.0 +
            (0.0 - ((dStack_12c0 + dStack_1290) - (dStack_12d0 + local_12a8)) *
                   0.0006666666666666666) * -2.2921694105207742e-20 *
            adStack_1480[6] * adStack_1480[0xc];
  dVar118 = adStack_1480[9] * 12000000.0;
  adStack_10e0[0x32] = adStack_10e0[0x32] + dVar302 + dVar118;
  adStack_10e0[0x35] = (adStack_10e0[0x35] - dVar117) - dVar118;
  dVar172 = adStack_1480[0xc] * -2.2921694105207742e-20;
  adStack_10e0[0x5c] = (dVar36 + adStack_10e0[0x5c]) - dVar172;
  adStack_10e0[0x5e] =
       dVar245 + dVar173 + adStack_10e0[0x5e] + dVar36 + dVar157 + dVar97 + dVar159 + dVar100 +
       dVar186 + dVar164 + dVar172;
  adStack_10e0[100] = dVar172 + adStack_10e0[100] + dVar100;
  dVar267 = adStack_1480[4] * 12000000.0;
  adStack_10e0[0x9e] = (adStack_10e0[0x9e] - dVar120) - dVar267;
  adStack_10e0[0xa0] = adStack_10e0[0xa0] + dVar246 + dVar267;
  dVar236 = adStack_1480[6] * -2.2921694105207742e-20;
  adStack_10e0[0xe2] = adStack_10e0[0xe2] + dVar161 + dVar236;
  local_2f0 = dVar324 + dVar225 + local_2f0 + dVar226 + dVar285 + dVar228 + dVar270 + dVar306 +
              dVar304 + dVar271 + dVar212;
  dVar173 = adStack_1480[9] * 70000000.0;
  local_1188 = ((((local_1188 - dVar208) + dVar140 + dVar144 + dVar84 + dVar86 + dVar90) - dVar92) -
               dVar110) - dVar173;
  local_1180 = ((((((local_1180 + dVar208) - dVar140) - dVar144) - dVar84) - dVar86) - dVar90) +
               dVar92 + dVar110 + dVar173;
  local_1148 = local_1148 - dVar173;
  local_1140 = dVar173 + dVar110 + local_1140 + dVar144;
  dVar193 = adStack_1480[10] * -1345932.1015318723;
  adStack_10e0[1] =
       ((((adStack_10e0[1] - dVar55) + dVar179 + dVar145 + dVar146 + dVar87 + dVar91) - dVar93) -
       dVar111) - dVar193;
  dVar92 = adStack_1480[1] * 70000000.0;
  adStack_10e0[0x9b] = adStack_10e0[0x9b] - dVar92;
  dVar159 = adStack_1480[2] * -1345932.1015318723;
  adStack_10e0[0xb1] = ((adStack_10e0[0xb1] + dVar83) - dVar264) - dVar159;
  dVar173 = adStack_1480[9] * 30000000.0 + adStack_1480[8] * -695983.1958864406;
  dVar100 = adStack_1480[6] * adStack_1480[9] * 0.0 +
            (0.0 - ((dStack_12c0 + dStack_12b0) - (dStack_12c0 + local_12a8)) *
                   0.0006666666666666666) * -695983.1958864406 * adStack_1480[6] * adStack_1480[8];
  dVar110 = adStack_1480[9] * adStack_1480[1] * 0.0 +
            (0.0 - ((dStack_12a0 + dStack_12e0) - (local_12e8 + local_12a8)) * 0.0006666666666666666
            ) * -1345932.1015318723 * adStack_1480[2] * adStack_1480[10];
  dVar245 = adStack_1480[6] * adStack_1480[9] * 30000000.0 +
            adStack_1480[6] * adStack_1480[8] * -695983.1958864406;
  dVar86 = adStack_1480[9] * adStack_1480[1] * 70000000.0 +
           adStack_1480[2] * adStack_1480[10] * -1345932.1015318723;
  adStack_10e0[0x60] = adStack_10e0[0x60] + dVar157 + dVar173;
  adStack_10e0[0x61] = ((adStack_10e0[0x61] + dVar97) - dVar172) - dVar173;
  adStack_10e0[0x1b9] =
       ((((adStack_10e0[0x1b9] - dVar128) + dVar81 + dVar284 + dVar293 + dVar222 + dVar224) -
        dVar225) - dVar210) - dVar110;
  adStack_1480[0x17] =
       ((((adStack_1480[0x17] - dVar201) + dVar205 + dVar221 + dVar239 + dVar147 + dVar148) -
        dVar256) - dVar233) - dVar86;
  dVar157 = ((((((((adStack_1480[0x1f] - dVar248) - dVar269) + dVar183) - dVar190) - dVar191) -
              dVar235) - dVar192) - dVar86) - dVar245;
  dVar172 = dVar86 + dVar243 + dVar243 +
                     ((dVar233 +
                      (((dVar240 +
                        (((dVar238 + (adStack_1480[0x20] - dVar268) + dVar215 + dVar218 + dVar221 +
                          dVar181) - dVar258) - dVar183)) - dVar28) - dVar25)) - dVar234);
  auVar24._8_4_ = SUB84(dVar172,0);
  auVar24._0_8_ = dVar157;
  auVar24._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar164 = ((((((((local_2d8 - dVar32) - dVar294) + dVar228) - dVar265) - dVar266) - dVar211) -
             dVar212) - dVar110) - dVar100;
  dVar172 = dVar110 + dVar297 + dVar297 +
                      ((dVar210 +
                       ((((((dVar291 + (dStack_2d0 - dVar38) + dVar280 + dVar281 + dVar284 + dVar223
                            ) - dVar285) - dVar228) + dVar270) - dVar312) - dVar311)) - dVar288);
  auVar30._8_4_ = SUB84(dVar172,0);
  auVar30._0_8_ = dVar164;
  auVar30._12_4_ = (int)((ulong)dVar172 >> 0x20);
  dVar97 = adStack_1480[0x11] * -0.09124785266815053;
  adStack_10e0[9] = ((((adStack_10e0[9] - dVar58) - dVar154) - dVar116) - dVar193) - dVar97;
  adStack_10e0[0x11] = dVar97 + dVar112 + adStack_10e0[0x11];
  dVar183 = adStack_1480[10] * 14528743.285075013;
  adStack_10e0[0x9c] = adStack_10e0[0x9c] + dVar59 + dVar156 + dVar120 + dVar92 + dVar183;
  adStack_10e0[0xab] = dVar183 + adStack_10e0[0xab];
  dVar140 = adStack_1480[9] * 14528743.285075013;
  dVar36 = adStack_1480[2] * -0.09124785266815053;
  adStack_10e0[0xc1] = dVar140 + dVar113 + (adStack_10e0[0xc1] - dVar135);
  adStack_10e0[0x14c] = adStack_10e0[0x14c] + dVar37 + dVar36;
  adStack_10e0[0x153] = adStack_10e0[0x153] - dVar36;
  adStack_10e0[0x154] = ((adStack_10e0[0x154] + dVar33) - dVar37) - dVar36;
  dVar186 = adStack_1480[0xb] * 19371657.71343335;
  adStack_10e0[0xa4] = dVar186 + dVar186 + ((dVar92 + (adStack_10e0[0xa4] - dVar246)) - dVar183);
  dVar208 = adStack_1480[10] * -36842.31259623495;
  adStack_10e0[0xa5] = adStack_10e0[0xa5] - dVar186;
  adStack_10e0[0xb9] = (((adStack_10e0[0xb9] + dVar259) - dVar159) - dVar140) - dVar208;
  dVar144 = adStack_1480[9] * 19371657.71343335;
  adStack_10e0[0xcf] = adStack_10e0[0xcf] - dVar144;
  dVar289 = adStack_1480[0xb] * adStack_1480[9] * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((dStack_12a0 + dStack_12a0) - (local_12a8 + local_1298)) * 0.0006666666666666666) *
            -18421.156298117476 * adStack_1480[10] * adStack_1480[10];
  dVar298 = adStack_1480[9] * adStack_1480[10] * -1852.146791076201 +
            (-0.00012748155533719572 -
            ((dStack_12e0 + local_1268) - (local_12a8 + dStack_12a0)) * 0.0006666666666666666) *
            -0.09124785266815053 * adStack_1480[0x11] * adStack_1480[2];
  dStack_2d0 = auVar30._8_8_;
  dVar84 = adStack_1480[0xb] * adStack_1480[9] * 19371657.71343335 +
           adStack_1480[10] * adStack_1480[10] * -18421.156298117476;
  dVar90 = adStack_1480[9] * adStack_1480[10] * 14528743.285075013 +
           adStack_1480[0x11] * adStack_1480[2] * -0.09124785266815053;
  adStack_1480[0x20] = auVar24._8_8_;
  dVar172 = adStack_1480[9] * adStack_1480[0xc] * 9000000.0 +
            adStack_1480[0xc] * adStack_1480[8] * -208794.958765932;
  dVar258 = adStack_1480[9] * adStack_1480[0xc] * 0.0 +
            (0.0 - ((dStack_1290 + dStack_12b0) - (local_12a8 + dStack_1290)) *
                   0.0006666666666666666) * -208794.958765932 * adStack_1480[0xc] * adStack_1480[8];
  dVar213 = adStack_1480[9] * 9000000.0 + adStack_1480[8] * -208794.958765932;
  adStack_10e0[0xe4] = adStack_10e0[0xe4] + dVar213;
  dVar173 = adStack_1480[9] * adStack_1480[0xd] * 7000000.0 +
            adStack_1480[0xd] * adStack_1480[8] * -162396.0790401699;
  dVar204 = adStack_1480[9] * adStack_1480[0xd] * 0.0 +
            (0.0 - ((local_1288 + dStack_12b0) - (local_12a8 + local_1288)) * 0.0006666666666666666)
            * -162396.0790401699 * adStack_1480[0xd] * adStack_1480[8];
  adStack_10e0[0x8c] =
       ((((((((adStack_10e0[0x8c] - dVar57) - dVar153) + dVar95) - dVar189) - dVar319) - dVar309) -
        dVar168) - dVar114) + adStack_1480[0x14] * -284545.07285187626 +
       adStack_1480[0x15] * -170727.04371112576 + adStack_1480[6] * -695983.1958864406 +
       adStack_1480[0xc] * -208794.958765932 + adStack_1480[0xd] * -162396.0790401699;
  adStack_10e0[0x8d] =
       ((((adStack_10e0[0x8d] - adStack_1480[0x14] * -284545.07285187626) -
         adStack_1480[0x15] * -170727.04371112576) - adStack_1480[6] * -695983.1958864406) -
       adStack_1480[0xc] * -208794.958765932) - adStack_1480[0xd] * -162396.0790401699;
  adStack_10e0[0xa2] =
       adStack_10e0[0xa2] + adStack_1480[0x14] * 12265169.958139507 +
       adStack_1480[0x15] * 7359101.974883704 + adStack_1480[6] * 30000000.0 +
       adStack_1480[0xc] * 9000000.0 + adStack_1480[0xd] * 7000000.0;
  dVar57 = adStack_1480[9] * 7000000.0 + adStack_1480[8] * -162396.0790401699;
  adStack_10e0[0xfa] = adStack_10e0[0xfa] + dVar57;
  dVar309 = adStack_1480[0xd] * 14000000.0;
  adStack_10e0[0xa3] =
       (((((((((((((adStack_10e0[0xa3] - dVar59) - dVar156) + dVar246) -
                adStack_1480[0x14] * 12265169.958139507) - adStack_1480[0x15] * 7359101.974883704) -
              dVar120) - dVar267) - dVar92) - adStack_1480[6] * 30000000.0) - dVar183) - dVar186) -
        adStack_1480[0xc] * 9000000.0) - adStack_1480[0xd] * 7000000.0) - dVar309;
  adStack_10e0[0xa6] = dVar267 + dVar120 + adStack_10e0[0xa6] + dVar309;
  adStack_10e0[0xa7] = adStack_10e0[0xa7] - dVar309;
  adStack_10e0[0xa9] = dVar309 + dVar156 + adStack_10e0[0xa9];
  dVar59 = adStack_1480[0xf] * -0.006485071999156734;
  adStack_10e0[0xe5] = (((adStack_10e0[0xe5] - dVar318) - dVar236) - dVar213) - dVar59;
  adStack_10e0[0xe9] = (dVar108 + dVar160 + dVar78 + adStack_10e0[0xe9]) - dVar59;
  dVar246 = adStack_1480[9] * 14000000.0;
  adStack_10e0[0xeb] = dVar59 + adStack_10e0[0xeb];
  adStack_10e0[0xfb] = (adStack_10e0[0xfb] - dVar57) - dVar246;
  adStack_10e0[0xfe] = (((adStack_10e0[0xfe] - dVar251) - dVar303) - dVar119) + dVar246;
  adStack_10e0[0xff] = (dVar119 + dVar303 + dVar251 + adStack_10e0[0xff] + dVar249) - dVar246;
  adStack_10e0[0x101] = dVar246 + adStack_10e0[0x101];
  dVar95 = adStack_1480[0xc] * -0.006485071999156734;
  adStack_10e0[0x127] = (adStack_10e0[0x127] - dVar227) - dVar95;
  adStack_10e0[0x12a] = adStack_10e0[0x12a] + dVar95;
  adStack_10e0[299] = adStack_10e0[299] - dVar95;
  dVar246 = adStack_1480[0x10] * -86596485.19199125;
  adStack_10e0[0x19] =
       dVar139 + ((((((((((((adStack_10e0[0x19] - dVar125) - dVar307) - dVar129) - dVar130) -
                        dVar131) - dVar62) - dVar64) - dVar67) - dVar69) - dVar71) - dVar73) -
                 dVar75) + dVar77 + dVar149 + dVar246;
  adStack_10e0[0x1a] = (((dVar307 + adStack_10e0[0x1a]) - dVar77) - dVar139) - dVar246;
  adStack_10e0[0x20] = ((adStack_10e0[0x20] - dVar131) + dVar62 + dVar71 + dVar73) - dVar246;
  adStack_10e0[0x26] = dVar246 + adStack_10e0[0x26];
  dVar62 = adStack_1480[10] * 1703.2356556327686;
  adStack_10e0[0x2f] = dVar283 + (adStack_10e0[0x2f] - dVar313) + dVar137 + dVar62;
  dVar119 = adStack_1480[4] * 1703.2356556327686;
  adStack_10e0[0xb3] = ((((adStack_10e0[0xb3] - dVar61) - dVar63) - dVar135) - dVar74) + dVar119;
  adStack_10e0[0xc0] = dVar119 + dVar209 + (adStack_10e0[0xc0] - dVar214);
  dVar77 = adStack_1480[3] * -86596485.19199125;
  adStack_10e0[0x137] = adStack_10e0[0x137] + dVar77;
  adStack_10e0[0x13e] = ((adStack_10e0[0x13e] + dVar254) - dVar328) - dVar77;
  dVar120 = adStack_1480[0xd] * adStack_1480[9] * 0.0 +
            (0.0 - ((dStack_1290 + local_1278) - (local_1288 + local_12a8)) * 0.0006666666666666666)
            * -0.006485071999156734 * adStack_1480[0xc] * adStack_1480[0xf];
  dVar57 = adStack_1480[10] * adStack_1480[4] * 10.970836066652648 +
           (0.006441173322300416 -
           ((local_12d8 + dStack_1270) - (dStack_12a0 + dStack_12d0)) * 0.0006666666666666666) *
           -86596485.19199125 * adStack_1480[3] * adStack_1480[0x10];
  dVar64 = adStack_1480[0xd] * adStack_1480[9] * 14000000.0 +
           adStack_1480[0xc] * adStack_1480[0xf] * -0.006485071999156734;
  dVar67 = adStack_1480[10] * adStack_1480[4] * 1703.2356556327686 +
           adStack_1480[3] * adStack_1480[0x10] * -86596485.19199125;
  local_1368 = (dVar232 + dVar229 + local_1368 + dVar176 + dVar199) - dVar64;
  dVar246 = adStack_1480[10] * 1793.8203338395704;
  adStack_10e0[0x31] =
       ((dVar313 + adStack_10e0[0x31] + dVar283) - dVar302) + dVar109 + dVar117 + dVar246;
  adStack_10e0[0x36] = ((adStack_10e0[0x36] - dVar103) - dVar62) - dVar246;
  dVar125 = adStack_1480[0xf] * -4.52122891906719e-05;
  adStack_10e0[0x46] =
       (((dVar182 + ((dVar308 + adStack_10e0[0x46]) - dVar80)) - dVar167) - dVar169) - dVar125;
  adStack_10e0[0x47] =
       (((((((((((((dVar143 + dVar143 +
                    dVar308 + dVar175 + adStack_10e0[0x47] + dVar132 + dVar65 + dVar70 + dVar76 +
                    dVar80 + dVar89) - dVar35) - (dVar150 + dVar150)) - dVar182) - dVar152) -
              dVar155) - dVar94) - dVar96) - dVar158) - dVar185) - dVar99) - dVar162) - dVar101) +
       dVar187 + dVar105 + dVar107 + dVar167 + dVar169 + dVar125;
  adStack_10e0[0x4c] =
       (((((adStack_10e0[0x4c] + dVar132 + dVar89) - dVar94) - dVar96) + dVar158) - dVar105) -
       dVar125;
  dVar75 = adStack_1480[4] * 1793.8203338395704;
  adStack_10e0[0x51] =
       dVar125 + dVar187 + ((dVar155 + dVar152 + (adStack_10e0[0x51] - dVar70)) - dVar162);
  adStack_10e0[0xb4] = ((adStack_10e0[0xb4] + dVar104) - dVar119) - dVar75;
  adStack_10e0[0xb5] =
       ((((adStack_10e0[0xb5] + dVar63 + dVar214) - dVar310) - dVar259) - dVar184) + dVar209 +
       dVar75;
  dVar92 = adStack_1480[5] * -4.52122891906719e-05;
  adStack_10e0[0x123] =
       ((((adStack_10e0[0x123] + dVar250) - dVar317) - dVar227) - dVar230) + dVar322 + dVar92;
  dVar309 = adStack_1480[10] * adStack_1480[10] * 296026.4442752242 +
            adStack_1480[2] * adStack_1480[0x12] * -159545083.58041438;
  dVar35 = adStack_1480[10] * adStack_1480[10] * 721.5278371512255 +
           (0.00243737629223557 -
           ((dStack_12e0 + dStack_1260) - (dStack_12a0 + dStack_12a0)) * 0.0006666666666666666) *
           -159545083.58041438 * adStack_1480[2] * adStack_1480[0x12];
  adStack_1480[0x18] =
       (((((((((adStack_1480[0x18] + dVar201 + dVar126 + dVar248 + dVar268 + dVar176) - dVar27) -
             dVar205) - dVar180) - dVar221) - dVar239) - dVar147) - dVar181) - dVar148) + dVar256 +
       dVar327 + dVar269 + dVar229 + dVar233 + dVar234 + dVar235 + dVar86 + dVar90 + dVar309;
  dVar125 = adStack_1480[0x12] * -159545083.58041438;
  adStack_10e0[2] =
       (((((((((adStack_10e0[2] + dVar55 + dVar56 + dVar58 + dVar60 + dVar66) - dVar301) - dVar179)
            - dVar142) - dVar145) - dVar146) - dVar87) - dVar88) - dVar91) + dVar93 + dVar121 +
       dVar154 + dVar98 + dVar111 + dVar112 + dVar116 + dVar193 + dVar97 + dVar125;
  adStack_10e0[10] =
       ((dVar193 + ((dVar111 + (adStack_10e0[10] - dVar60) + dVar145 + dVar88) - dVar112)) - dVar97)
       - (dVar125 + dVar125);
  dVar56 = adStack_1480[10] * 592052.8885504483;
  adStack_10e0[0x12] = dVar125 + adStack_10e0[0x12] + dVar91;
  adStack_10e0[0xb2] =
       (((adStack_10e0[0xb2] + dVar61) - dVar83) - dVar214) + dVar264 + dVar113 + dVar159 + dVar140
       + dVar56;
  adStack_1480[2] = adStack_1480[2] * -159545083.58041438;
  adStack_10e0[0x162] = (adStack_10e0[0x162] - dVar244) + adStack_1480[2];
  local_310._8_8_ =
       dVar226 + (((((((((((((double)local_310._8_8_ - dVar128) - dVar305) - dVar299) - dVar32) -
                        dVar38) - dVar280) - dVar290) - dVar216) - dVar217) - dVar281) - dVar291) -
                 dVar219) + dVar282 + dVar124 + dVar57;
  local_310._0_8_ =
       ((((((((((double)local_310._0_8_ + dVar54 + dVar128 + dVar299 + dVar32 + dVar38 + dVar216) -
              dVar124) - dVar81) - dVar220) - dVar284) - dVar293) - dVar222) - dVar223) - dVar224) +
       dVar225 + dVar321 + dVar294 + dVar261 + dVar210 + dVar288 + dVar211 + dVar110 + dVar298 +
       dVar35;
  dVar110 = adStack_1480[0xe] * 26480000.0;
  adStack_10e0[0xbc] = dVar110 + adStack_10e0[0xbc];
  dVar58 = adStack_1480[0xc] * -0.0002710754168835943;
  adStack_10e0[0xd2] = dVar58 + adStack_10e0[0xd2];
  dVar55 = adStack_1480[0xb] * -0.0002710754168835943;
  adStack_10e0[0xe6] = adStack_10e0[0xe6] - dVar55;
  adStack_10e0[0xe7] = dVar55 + adStack_10e0[0xe7];
  dVar76 = adStack_1480[10] * 26480000.0;
  dVar65 = adStack_1480[0xe] * adStack_1480[10] * 0.0 +
           (0.0 - ((dStack_1290 + local_1298) - (dStack_1280 + dStack_12a0)) * 0.0006666666666666666
           ) * -0.0002710754168835943 * adStack_1480[0xc] * adStack_1480[0xb];
  dVar69 = adStack_1480[10] * adStack_1480[4] * 3.5866496754579007 +
           (0.001999447552130754 -
           ((local_1278 + local_12c8) - (dStack_12a0 + dStack_12d0)) * 0.0006666666666666666) *
           -4.52122891906719e-05 * adStack_1480[0xf] * adStack_1480[5];
  dStack_2f8 = dVar296 + (((((((((((((dVar220 + dVar220 +
                                      dVar128 + dStack_2f8 + dVar305 + dVar280 + dVar290 + dVar217 +
                                      dVar219 + dVar124 + dVar223) - dVar225) - (dVar226 + dVar226))
                                  - dVar324) - dVar321) - dVar294) - dVar285) - dVar228) - dVar270)
                            - dVar261) - dVar306) - dVar304) - dVar271) + dVar263 + dVar311 +
                         dVar287 + dVar211 + dVar69;
  dVar70 = adStack_1480[0xe] * adStack_1480[10] * 26480000.0 +
           adStack_1480[0xc] * adStack_1480[0xb] * -0.0002710754168835943;
  dVar73 = adStack_1480[10] * adStack_1480[4] * 1793.8203338395704 +
           adStack_1480[0xf] * adStack_1480[5] * -4.52122891906719e-05;
  adStack_1480[0x1c] = adStack_1480[0x1c] + dVar295 + dVar286 + dVar241 + dVar192;
  adStack_1480[0x1b] = local_1240 + dVar73;
  dVar125 = adStack_1480[10] * adStack_1480[0xf] * 390998.5057150522 +
            adStack_1480[0xb] * adStack_1480[0xe] * -2156.4740241498666;
  dVar60 = adStack_1480[10] * adStack_1480[0xf] * 1244.9131168262245 +
           (0.003183933182940293 -
           ((local_1298 + dStack_1280) - (dStack_12a0 + local_1278)) * 0.0006666666666666666) *
           -2156.4740241498666 * adStack_1480[0xb] * adStack_1480[0xe];
  dVar86 = adStack_1480[0xf] * 390998.5057150522;
  adStack_10e0[0xbe] = ((adStack_10e0[0xbe] + dVar135) - dVar110) + dVar86;
  adStack_10e0[0xbf] = (dVar75 + dVar61 + adStack_10e0[0xbf] + dVar74) - dVar86;
  dVar121 = adStack_1480[0xe] * -2156.4740241498666;
  adStack_10e0[0xd4] = (adStack_10e0[0xd4] - dVar58) + dVar121;
  adStack_10e0[0xd5] = adStack_10e0[0xd5] - dVar121;
  dVar71 = adStack_1480[0xb] * -2156.4740241498666;
  adStack_10e0[0x112] = ((adStack_10e0[0x112] + dVar72) - dVar76) - dVar71;
  adStack_10e0[0x113] = dVar76 + adStack_10e0[0x113] + dVar71;
  adStack_10e0[0x117] = ((((adStack_10e0[0x117] - dVar170) - dVar79) - dVar207) - dVar163) - dVar71;
  dVar66 = adStack_1480[10] * 390998.5057150522;
  adStack_10e0[0x128] = (((adStack_10e0[0x128] - dVar300) + dVar136) - dVar92) - dVar66;
  adStack_10e0[0x129] = adStack_10e0[0x129] + dVar66;
  adStack_10e0[300] = adStack_10e0[300] + dVar250 + dVar252 + dVar253 + dVar230 + dVar66;
  dVar97 = adStack_1480[0x13] * 61950.158398051455;
  adStack_10e0[0xba] =
       ((((((dVar208 + dVar208 +
            ((dVar159 +
             dVar115 + dVar115 +
             ((dVar264 +
              (((((((adStack_10e0[0xba] - dVar61) + dVar63 + dVar135 + dVar74 + dVar83 + dVar214) -
                  dVar310) - dVar259) + dVar184) - dVar104) - dVar209)) - dVar113)) - dVar140)) -
           dVar119) - dVar75) - (dVar56 + dVar56)) - dVar110) - dVar86) - dVar97;
  adStack_10e0[0xbb] =
       dVar110 + (((dVar104 + (((adStack_10e0[0xbb] - dVar63) - dVar83) - dVar184)) - dVar115) -
                 dVar208) + dVar86 + dVar97;
  adStack_10e0[0xc2] = dVar56 + (adStack_10e0[0xc2] - dVar74) + dVar97;
  adStack_10e0[0xc3] = adStack_10e0[0xc3] - dVar97;
  dVar214 = adStack_1480[0x12] * -5603.460820379699;
  adStack_10e0[0xd0] =
       (((dVar144 + dVar144 +
         dVar320 + dVar320 + ((adStack_10e0[0xd0] + dVar203 + dVar206 + dVar260) - dVar122)) -
        dVar58) - dVar121) - dVar214;
  adStack_10e0[0xd1] =
       dVar58 + (((dVar122 + (((adStack_10e0[0xd1] - dVar203) - dVar206) - dVar260)) - dVar320) -
                dVar144) + dVar121 + dVar214;
  adStack_10e0[0xd8] = adStack_10e0[0xd8] + dVar214;
  adStack_10e0[0xd9] = adStack_10e0[0xd9] - dVar214;
  dVar214 = adStack_1480[0xb] * -5603.460820379699;
  adStack_10e0[0x16a] =
       ((adStack_10e0[0x16a] + dVar315) - (adStack_1480[2] + adStack_1480[2])) - dVar214;
  adStack_10e0[0x16b] = adStack_10e0[0x16b] + dVar214;
  dVar206 = adStack_1480[10] * 61950.158398051455;
  adStack_10e0[0x173] = (((adStack_10e0[0x173] - dVar34) - dVar244) - dVar102) - dVar214;
  adStack_10e0[0x180] = adStack_10e0[0x180] - dVar206;
  adStack_10e0[0x181] = adStack_10e0[0x181] + dVar206;
  adStack_10e0[0x188] = adStack_10e0[0x188] + dVar171 + dVar255 + dVar262 + dVar206;
  adStack_10e0[0x189] = (((adStack_10e0[0x189] - dVar171) - dVar255) - dVar262) - dVar206;
  dVar122 = adStack_1480[0xe] * 6645614.320408218;
  dVar171 = adStack_1480[10] * adStack_1480[0x13] * 216.6497304178424 +
            (0.0034971618478485886 -
            ((dStack_1260 + local_1298) - (local_1258 + dStack_12a0)) * 0.0006666666666666666) *
            -5603.460820379699 * adStack_1480[0x12] * adStack_1480[0xb];
  dVar206 = adStack_1480[4] * adStack_1480[0xe] * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((dStack_1290 + local_12b8) - (dStack_1280 + dStack_12d0)) * 0.0006666666666666666) *
            -132.4388903689313 * adStack_1480[0xc] * adStack_1480[7];
  dVar121 = adStack_1480[10] * adStack_1480[0x13] * 61950.158398051455 +
            adStack_1480[0x12] * adStack_1480[0xb] * -5603.460820379699;
  dVar119 = adStack_1480[4] * adStack_1480[0xe] * 6645614.320408218 +
            adStack_1480[0xc] * adStack_1480[7] * -132.4388903689313;
  adStack_10e0[0x38] = dVar118 + dVar117 + (adStack_10e0[0x38] - dVar137) + dVar122;
  adStack_10e0[0x3a] = (dVar109 + adStack_10e0[0x3a] + dVar325) - dVar122;
  adStack_1480[0xc] = adStack_1480[0xc] * -132.4388903689313;
  adStack_10e0[0x7a] = (adStack_10e0[0x7a] - dVar166) + adStack_1480[0xc];
  adStack_10e0[0x7c] = (adStack_10e0[0x7c] + dVar138) - adStack_1480[0xc];
  dVar86 = adStack_1480[7] * -132.4388903689313;
  adStack_10e0[0xe0] = (((adStack_10e0[0xe0] - dVar78) - dVar318) - dVar236) - dVar86;
  adStack_10e0[0xe3] = (adStack_10e0[0xe3] - dVar108) + dVar86;
  adStack_10e0[0xe8] =
       dVar55 + dVar236 + dVar318 + ((((((adStack_10e0[0xe8] + dVar133) - dVar78) + dVar316) -
                                      dVar160) + dVar161) - dVar108) + dVar59 + dVar86;
  adStack_10e0[0xea] = ((((adStack_10e0[0xea] - dVar133) - dVar316) - dVar161) - dVar55) - dVar86;
  dVar318 = adStack_1480[4] * 6645614.320408218;
  adStack_10e0[0x10c] = ((adStack_10e0[0x10c] - dVar79) - dVar323) - dVar318;
  adStack_10e0[0x10f] = adStack_10e0[0x10f] + dVar79 + dVar318;
  adStack_10e0[0x114] = dVar76 + adStack_10e0[0x114] + dVar134 + dVar85 + dVar247 + dVar318;
  adStack_10e0[0x116] =
       (((dVar323 +
         (((((((dVar174 + dVar314 + adStack_10e0[0x116]) - dVar134) - dVar68) + dVar170 + dVar72 +
            dVar79) - dVar85) + dVar207) - dVar247) + dVar163) - dVar76) + dVar71) - dVar318;
  dStack_2d0 = ((((((dVar289 + dVar289 + (dStack_2d0 - dVar298)) - dVar57) - dVar69) -
                 (dVar35 + dVar35)) - dVar65) - dVar60) - dVar171;
  local_2d8 = ((((dVar164 - dVar298) - dVar289) - dVar258) - dVar204) - dVar120;
  local_288 = (((local_288 - dVar219) - dVar224) - dVar271) - dVar171;
  adStack_1480[0x20] =
       ((((((dVar84 + dVar84 + (adStack_1480[0x20] - dVar90)) - dVar67) - dVar73) -
         (dVar309 + dVar309)) - dVar70) - dVar125) - dVar121;
  adStack_1480[0x1f] = ((((dVar157 - dVar90) - dVar84) - dVar172) - dVar173) - dVar64;
  dVar174 = dVar70 + dVar192 + dVar235 + ((dVar295 +
                                          ((dVar239 +
                                           ((dVar237 + (double)local_1378._8_8_) - dVar199)) -
                                          dVar229)) - dVar232) + dVar64 + dVar119;
  local_1338 = (((local_1338 - dVar178) - dVar148) - dVar241) - dVar121;
  local_1378._8_4_ = SUB84(dVar174,0);
  local_1378._0_8_ =
       dVar70 + (((((((double)local_1378._0_8_ - dVar215) - dVar221) - dVar240) + dVar28) - dVar243)
                - dVar84) + dVar125 + dVar121;
  local_1378._12_4_ = (int)((ulong)dVar174 >> 0x20);
  dStack_1360 = (((dVar242 +
                  (((((((dStack_1360 + dVar126 + dVar248) - dVar237) - dVar176) + dVar177 + dVar218
                     + dVar26) - dVar239) + dVar147) - dVar295) + dVar286) - dVar70) + dVar125) -
                dVar119;
  local_2c8 = dVar65 + (((dVar312 + (((local_2c8 - dVar280) - dVar284) - dVar270)) - dVar297) -
                       dVar289) + dVar60 + dVar171;
  local_2b8 = (local_2b8 + dVar287) - dVar120;
  dStack_2c0 = dVar65 + dVar212 + dVar211 + (dVar200 - dVar287) + dVar120 + dVar206;
  dStack_2b0 = (((((((((((dStack_2b0 - dVar54) + dVar299 + dVar32) - dVar290) - dVar216) + dVar217 +
                      dVar281 + dVar292) - dVar293) + dVar222) - dVar306) + dVar304 + dVar296) -
                dVar65) + dVar60) - dVar206;
  dVar54 = adStack_1480[0x10] * 1923289.8439964922;
  adStack_10e0[0x3b] = dVar246 + (adStack_10e0[0x3b] - dVar325) + dVar54;
  adStack_10e0[0x3c] = (dVar62 + adStack_10e0[0x3c]) - dVar54;
  dVar200 = adStack_1480[0xf] * -43.301595906050935;
  adStack_10e0[0x7d] = dVar188 + (adStack_10e0[0x7d] - dVar138) + dVar200;
  adStack_10e0[0x7e] = (dVar106 + adStack_10e0[0x7e]) - dVar200;
  dVar126 = adStack_1480[7] * -43.301595906050935;
  adStack_10e0[0x122] = ((adStack_10e0[0x122] - dVar252) - dVar92) - dVar126;
  adStack_10e0[0x125] = ((adStack_10e0[0x125] + dVar252) - dVar322) + dVar126;
  adStack_10e0[0x12d] =
       ((dVar92 + dVar95 + dVar322 + ((dVar227 +
                                      dVar317 + (((((dVar300 + adStack_10e0[0x12d]) - dVar250) +
                                                  dVar136) - dVar252) - dVar253)) - dVar230)) -
       dVar66) + dVar126;
  adStack_10e0[0x12e] = adStack_10e0[0x12e] - dVar126;
  dVar126 = adStack_1480[4] * 1923289.8439964922;
  adStack_10e0[0x138] = (adStack_10e0[0x138] - dVar77) - dVar126;
  adStack_10e0[0x13b] = (adStack_10e0[0x13b] - dVar328) + dVar126;
  adStack_10e0[0x143] = adStack_10e0[0x143] + dVar126;
  adStack_10e0[0x144] = (dVar77 + dVar328 + (adStack_10e0[0x144] - dVar254)) - dVar126;
  dVar170 = adStack_1480[0x12] * 228932.11193603993;
  dVar126 = adStack_1480[0x10] * adStack_1480[4] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((local_12b8 + local_1278) - (dStack_12d0 + dStack_1270)) * 0.0006666666666666666) *
            -43.301595906050935 * adStack_1480[7] * adStack_1480[0xf];
  dVar174 = adStack_1480[4] * adStack_1480[0x12] * 198.4042264437053 +
            (0.0008666509244414622 -
            ((local_1268 + local_12b8) - (dStack_1260 + dStack_12d0)) * 0.0006666666666666666) *
            -5461.432196104055 * adStack_1480[0x11] * adStack_1480[7];
  adStack_10e0[0x30] =
       ((((((((dVar302 + ((((dVar313 + adStack_10e0[0x30]) - dVar137) - dVar325) - dVar283) +
                         dVar326 + dVar103) - dVar109) - dVar117) - dVar118) - dVar62) - dVar246) -
        dVar122) - dVar54) - dVar170;
  adStack_10e0[0x33] =
       (((((adStack_10e0[0x33] - dVar313) + dVar325) - dVar326) - dVar302) - dVar103) + dVar122 +
       dVar54 + dVar170;
  adStack_10e0[0x3d] = adStack_10e0[0x3d] + dVar170;
  adStack_10e0[0x3e] = adStack_10e0[0x3e] - dVar170;
  dVar54 = adStack_1480[0x11] * -5461.432196104055;
  adStack_10e0[0x72] =
       (((dVar151 + ((dVar202 + adStack_10e0[0x72]) - dVar138) + dVar141 + dVar165) -
        adStack_1480[0xc]) - dVar200) - dVar54;
  adStack_10e0[0x75] =
       (((((((((adStack_10e0[0x75] - dVar202) + dVar138) - dVar141) - dVar82) - dVar151) - dVar188)
         - dVar165) - dVar106) - dVar166) + adStack_1480[0xc] + dVar200 + dVar54;
  adStack_10e0[0x7f] = adStack_10e0[0x7f] + dVar54;
  adStack_10e0[0x80] = adStack_10e0[0x80] - dVar54;
  dVar54 = adStack_1480[7] * -5461.432196104055;
  adStack_10e0[0x14e] = adStack_10e0[0x14e] - dVar54;
  adStack_10e0[0x151] = adStack_10e0[0x151] + dVar54;
  adStack_10e0[0x15b] = dVar36 + dVar37 + (adStack_10e0[0x15b] - dVar33) + dVar54;
  adStack_10e0[0x15c] = adStack_10e0[0x15c] - dVar54;
  dVar54 = adStack_1480[4] * 228932.11193603993;
  adStack_10e0[0x164] = adStack_10e0[0x164] - dVar54;
  adStack_10e0[0x167] = adStack_10e0[0x167] + dVar54;
  adStack_10e0[0x171] = adStack_10e0[0x171] + dVar54;
  adStack_10e0[0x172] =
       (adStack_1480[2] + (adStack_10e0[0x172] - dVar315) + dVar34 + dVar244 + dVar102 + dVar214) -
       dVar54;
  dStack_2a8 = ((dVar69 + (((((((dStack_2a8 + dVar38) - dVar217) + dVar291) - dVar292) - dVar222) +
                            dVar321 + dVar294) - dVar304) + dVar263 + dVar120) - dVar60) + dVar126;
  dVar54 = adStack_1480[0x10] * adStack_1480[4] * 1923289.8439964922 +
           adStack_1480[7] * adStack_1480[0xf] * -43.301595906050935;
  dVar200 = adStack_1480[4] * adStack_1480[0x12] * 228932.11193603993 +
            adStack_1480[0x11] * adStack_1480[7] * -5461.432196104055;
  dStack_1358 = ((dVar73 + ((dVar269 +
                            (((((dStack_1358 + dVar268) - dVar177) + dVar238) - dVar26) - dVar147) +
                            dVar327) - dVar286) + dVar231 + dVar64) - dVar125) + dVar54;
  adStack_1480[0x1a] =
       ((((((((dVar329 + (((adStack_1480[0x1a] - dVar199) - dVar26) - dVar27) + dVar205 + dVar28) -
             dVar242) - dVar235) - dVar192) - dVar67) - dVar73) - dVar119) - dVar54) - dVar200;
  adStack_1480[0x19] =
       dVar257 + (((((((((dVar31 - dVar248) - dVar268) - dVar215) - dVar237) - dVar176) - dVar177) -
                   dVar218) - dVar238) - dVar178) + dVar199 + dVar27 + dVar67;
  adStack_1480[0x1e] =
       ((((adStack_1480[0x1e] - dVar242) - dVar233) - dVar234) - dVar243) + dVar190 + dVar191 +
       dVar245 + dVar172 + dVar173;
  adStack_1480[0x1d] = ((dVar198 - dVar25) - dVar232) + dVar119 + dVar54 + dVar200;
  local_1350 = (dVar67 + dVar25 + (local_1350 - dVar181)) - dVar54;
  dStack_1348 = dVar200 + dVar90 + (dStack_1348 - dVar218) + dVar234;
  dStack_1340 = ((dStack_1340 - dVar238) + dVar178 + dVar148 + dVar241 + dVar309 + dVar121) -
                dVar200;
  local_300 = ((((((((dVar324 + ((((dVar305 + local_300) - dVar282) - dVar292) - dVar124) + dVar81 +
                     dVar312) - dVar296) - dVar211) - dVar212) - dVar57) - dVar69) - dVar206) -
              dVar126) - dVar174;
  dStack_2e0 = ((((dStack_2e0 - dVar296) - dVar210) - dVar288) - dVar297) + dVar265 + dVar266 +
               dVar100 + dVar258 + dVar204;
  local_2e8 = ((dVar127 - dVar311) - dVar287) + dVar206 + dVar126 + dVar174;
  local_2a0 = ((local_2a0 - dVar223) + dVar311 + dVar57) - dVar126;
  dStack_298 = dVar174 + dVar298 + (dStack_298 - dVar281) + dVar288;
  dStack_290 = ((dStack_290 - dVar291) + dVar219 + dVar224 + dVar271 + dVar35 + dVar171) - dVar174;
  if (local_264 == 0) {
    local_238[0] = 2.8822959451999997;
    local_238[1] = 1.4999999982659773;
    local_238[2] = 1.507252090419375;
    local_238[3] = 3.398993884662499;
    local_238[4] = 2.9627907471999997;
    local_238[5] = 4.687841430575;
    local_238[6] = 5.2821630604062495;
    local_238[7] = 4.97163097458125;
    local_238[8] = 4.98750050771875;
    local_238[9] = 7.198434206537501;
    local_238[10] = 9.874274296874997;
    local_238[0xb] = 3.2349510160250006;
    local_238[0xc] = 6.023470866475001;
    local_238[0xd] = 5.33591319330625;
    local_238[0xe] = 7.5590570047500005;
    local_238[0xf] = 9.825474777499998;
    local_238[0x10] = 12.2373674399375;
    local_238[0x11] = 14.246951215250002;
    local_238[0x12] = 16.552933378125;
    local_238[0x13] = 3.1861203930625;
    local_238[0x14] = 1.5;
    local_188[0] = 0.000507239459;
    local_188[1] = 1.4767295125000317e-13;
    local_188[2] = -1.116620304e-05;
    local_188[3] = 0.00033054475434999984;
    local_188[4] = 0.0004928155568499999;
    local_188[5] = 0.0012567384129500002;
    local_188[6] = 0.0009643321552500001;
    local_188[7] = 0.0009323347502999997;
    local_188[8] = 0.0009823763672500007;
    local_188[9] = 0.0016686828392500003;
    local_188[10] = 0.0030726129075;
    local_188[0xb] = 0.00034398350740000034;
    local_188[0xc] = 0.0006661732772499996;
    local_188[0xd] = 0.0007601921039999995;
    local_188[0xe] = 0.0015323131260000008;
    local_188[0xf] = 0.0022796327649999997;
    local_188[0x10] = 0.0027535931289999994;
    local_188[0x11] = 0.0032581048315000038;
    local_188[0x12] = 0.0039887186525;
    local_188[0x13] = 0.00037292862650000006;
    local_188[0x14] = 0.0;
    local_d8 = 1.9101473600491665;
    dVar205 = 2.079423123570834;
    dVar206 = 1.0030833333333333;
    dVar126 = 17.914627724425;
    dVar198 = 2.874817692333335;
    uVar194 = 0xcd68d3ff;
    uVar196 = 0x401c50aa;
    uVar195 = 0xb9f4c317;
    uVar197 = 0x4026ca5f;
    dVar200 = 6.7442483232375;
    dVar127 = -4.227135418966667;
    dVar172 = -6.748131844745;
    dVar173 = -27.605086887896665;
    dVar174 = 16.114317783399166;
    dVar170 = -0.5650564362916671;
    dVar54 = 34.602608086557915;
    dVar125 = 37.543891960460414;
    uVar272 = 0x8f96a67a;
    uVar273 = 0xc030862a;
    uVar274 = 0xc1acfd07;
    uVar275 = 0x40118709;
    dVar171 = 2.2555381179699996;
    dVar199 = 5.1092103122075;
    uVar276 = 0x2efd9734;
    uVar277 = 0x40327b81;
    uVar278 = 0xaf13a7dd;
    uVar279 = 0x403501f0;
    pdVar41 = local_d0;
    pdVar44 = local_c0;
    pdVar45 = local_b0;
    pdVar49 = local_a0;
    pdVar50 = local_90;
    pdVar52 = local_80;
    pdVar53 = local_70;
    pdVar47 = local_60;
    local_248 = local_258;
    local_250 = local_260;
  }
  else {
    local_238[0] = 3.8822959451999997;
    local_238[1] = 2.4999999982659773;
    local_238[2] = 2.507252090419375;
    local_238[3] = 4.398993884662499;
    local_238[4] = 3.9627907472;
    local_238[5] = 5.687841430575;
    local_238[6] = 6.28216306040625;
    local_238[7] = 5.971630974581251;
    local_238[8] = 5.98750050771875;
    local_238[9] = 8.1984342065375;
    local_238[10] = 10.874274296874997;
    local_238[0xb] = 4.234951016024999;
    local_238[0xc] = 7.023470866475001;
    local_238[0xd] = 6.33591319330625;
    local_238[0xe] = 8.55905700475;
    local_238[0xf] = 10.825474777499998;
    local_238[0x10] = 13.237367439937499;
    local_238[0x11] = 15.24695121525;
    local_238[0x12] = 17.552933378125;
    local_238[0x13] = 4.1861203930625;
    local_238[0x14] = 2.5;
    local_188[0] = 0.000507239459;
    dVar205 = 0.00037292862650000006;
    dVar206 = 0.0;
    dVar126 = 0.0032581048315000038;
    dVar198 = 0.0039887186525;
    uVar194 = 0x8585a725;
    uVar196 = 0x3f62acbc;
    uVar195 = 0xdeffcb6;
    uVar197 = 0x3f668eb4;
    dVar200 = 0.0007601921039999995;
    dVar127 = 0.0015323131260000008;
    dVar172 = 0.00034398350740000034;
    dVar173 = 0.0006661732772499996;
    dVar174 = 0.0016686828392500003;
    dVar170 = 0.0030726129075;
    dVar54 = 0.0009323347502999997;
    dVar125 = 0.0009823763672500007;
    uVar272 = 0x98871f3d;
    uVar273 = 0x3f549724;
    uVar274 = 0x88de2a4d;
    uVar275 = 0x3f4f9967;
    dVar171 = 0.00033054475434999984;
    dVar199 = 0.0004928155568499999;
    uVar276 = 0x91b4691f;
    uVar277 = 0x3d44c87a;
    uVar278 = 0x42942cb3;
    uVar279 = 0xbee76acf;
    pdVar42 = &local_12e8;
    pdVar41 = local_188 + 1;
    pdVar44 = local_188 + 3;
  }
  *(undefined4 *)pdVar41 = uVar276;
  *(undefined4 *)((long)pdVar41 + 4) = uVar277;
  *(undefined4 *)(pdVar41 + 1) = uVar278;
  *(undefined4 *)((long)pdVar41 + 0xc) = uVar279;
  *pdVar44 = dVar171;
  pdVar44[1] = dVar199;
  *(undefined4 *)pdVar45 = uVar272;
  *(undefined4 *)((long)pdVar45 + 4) = uVar273;
  *(undefined4 *)(pdVar45 + 1) = uVar274;
  *(undefined4 *)((long)pdVar45 + 0xc) = uVar275;
  *pdVar49 = dVar54;
  pdVar49[1] = dVar125;
  *pdVar50 = dVar174;
  pdVar50[1] = dVar170;
  *pdVar52 = dVar172;
  pdVar52[1] = dVar173;
  *pdVar53 = dVar200;
  pdVar53[1] = dVar127;
  *(undefined4 *)pdVar47 = uVar194;
  *(undefined4 *)((long)pdVar47 + 4) = uVar196;
  *(undefined4 *)(pdVar47 + 1) = uVar195;
  *(undefined4 *)((long)pdVar47 + 0xc) = uVar197;
  *local_248 = dVar126;
  local_248[1] = dVar198;
  *local_250 = dVar205;
  local_250[1] = dVar206;
  dVar198 = 0.0;
  dVar125 = 0.0;
  dVar126 = 0.0;
  lVar40 = 0;
  dVar54 = 0.0;
  do {
    dVar200 = *(double *)((long)adStack_1480 + lVar40 + 8U);
    dVar54 = dVar54 + *(double *)((long)local_238 + lVar40) * dVar200;
    dVar127 = *(double *)((long)pdVar42 + lVar40);
    dVar172 = *(double *)((long)adStack_1480 + lVar40 + 0xb8U);
    dVar198 = dVar198 + dVar200 * *(double *)((long)local_188 + lVar40);
    dVar125 = dVar125 + dVar172 * dVar127;
    dVar126 = dVar126 + (*(double *)((long)local_238 + lVar40) - dVar127) * 0.0006666666666666666 *
                        dVar172 + dVar127 * *(double *)(local_310 + lVar40 + -8);
    lVar40 = lVar40 + 8;
  } while (lVar40 != 0xa8);
  dVar125 = dVar125 * (1.0 / dVar54);
  dVar200 = (1.0 / dVar54) * 1500.0;
  dVar54 = dVar125 * dVar200;
  lVar40 = 0;
  do {
    dVar127 = 0.0;
    lVar46 = 0;
    do {
      dVar127 = dVar127 + pdVar42[lVar46] * __s[lVar46];
      lVar46 = lVar46 + 1;
    } while (lVar46 != 0x15);
    adStack_10e0[lVar40 * 0x16] = local_238[lVar40] * dVar54 + dVar127 * -dVar200;
    lVar40 = lVar40 + 1;
    __s = __s + 0x16;
  } while (lVar40 != 0x15);
  pdVar42 = &local_1188;
  local_270 = (dVar54 * dVar198 - dVar125) - dVar200 * dVar126;
  *local_240 = 0;
  iVar43 = 0;
  lVar40 = 0;
  iVar48 = 0;
  do {
    lVar46 = 0;
    do {
      iVar51 = (int)lVar46;
      if (lVar40 == lVar46) {
        rowVals[iVar48] = iVar51;
        iVar39 = iVar43;
LAB_00193ca8:
        indx[iVar48] = iVar39 + iVar51;
        iVar48 = iVar48 + 1;
      }
      else if ((pdVar42[lVar46] != 0.0) || (NAN(pdVar42[lVar46]))) {
        rowVals[iVar48] = iVar51;
        iVar39 = (int)lVar40 * 0x16;
        goto LAB_00193ca8;
      }
      lVar46 = lVar46 + 1;
    } while (lVar46 != 0x16);
    local_240[lVar40 + 1] = iVar48;
    lVar40 = lVar40 + 1;
    iVar43 = iVar43 + 0x16;
    pdVar42 = pdVar42 + 0x16;
    if (lVar40 == 0x16) {
      return;
    }
  } while( true );
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
  int* rowVals, int* colPtrs, int* indx, const int* consP)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  colPtrs[0] = 0;
  int nJdata_tmp = 0;
  for (int k = 0; k < 22; k++) {
    for (int l = 0; l < 22; l++) {
      if (k == l) {
        rowVals[nJdata_tmp] = l;
        indx[nJdata_tmp] = 22 * k + l;
        nJdata_tmp = nJdata_tmp + 1;
      } else {
        if (Jac[22 * k + l] != 0.0) {
          rowVals[nJdata_tmp] = l;
          indx[nJdata_tmp] = 22 * k + l;
          nJdata_tmp = nJdata_tmp + 1;
        }
      }
    }
    colPtrs[k + 1] = nJdata_tmp;
  }
}